

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  size_t k;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar62;
  int iVar63;
  uint uVar64;
  AABBNodeMB4D *node1;
  ulong uVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  undefined4 uVar69;
  long lVar70;
  NodeRef NVar71;
  ulong *puVar72;
  undefined1 (*pauVar73) [16];
  ulong uVar74;
  Geometry *pGVar75;
  ulong uVar76;
  long lVar77;
  ulong uVar78;
  RayQueryContext *pRVar79;
  RayK<4> *pRVar80;
  long lVar81;
  ulong uVar82;
  bool bVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 in_ZMM0 [64];
  float fVar112;
  float fVar113;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar114;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar111 [64];
  float fVar118;
  float fVar131;
  vint4 ai_2;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar132;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar146;
  float fVar147;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar144 [32];
  float fVar148;
  float fVar152;
  float fVar153;
  undefined1 auVar145 [32];
  float fVar154;
  vint4 bi_3;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar171;
  float fVar172;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined4 uVar173;
  vint4 bi;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar193;
  float fVar194;
  vint4 bi_2;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [32];
  float fVar199;
  float fVar200;
  float fVar208;
  float fVar210;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar214;
  float fVar216;
  float fVar218;
  undefined1 auVar205 [32];
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar217;
  float fVar219;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar220;
  float fVar225;
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar223 [32];
  float fVar227;
  undefined1 auVar224 [32];
  float fVar231;
  float fVar235;
  float fVar236;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar234 [32];
  undefined1 auVar241 [32];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar259;
  float fVar260;
  vint4 ai;
  undefined1 auVar257 [16];
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar258 [32];
  float fVar265;
  vint4 ai_1;
  undefined1 auVar266 [16];
  undefined1 auVar267 [32];
  float fVar268;
  float fVar269;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  vint4 ai_3;
  undefined1 auVar270 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar271 [32];
  float fVar284;
  undefined1 auVar285 [32];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar286 [64];
  UVIdentity<8> mapUV;
  Precalculations pre;
  vbool<4> terminated;
  vbool<4> valid0;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  vint<4> itime;
  vfloat<4> ftime;
  PlueckerHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 local_1dc1;
  undefined1 (*local_1dc0) [16];
  ulong *local_1db8;
  NodeRef local_1db0;
  Precalculations local_1da1;
  ulong local_1da0;
  uint local_1d94;
  ulong local_1d90;
  long local_1d88;
  long local_1d80;
  uint local_1d78;
  uint local_1d74;
  undefined1 local_1d70 [16];
  undefined1 local_1d60 [8];
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  RayK<4> *local_1d28;
  RayQueryContext *local_1d20;
  ulong local_1d18;
  undefined1 local_1d10 [16];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined8 local_1cb0;
  undefined8 uStack_1ca8;
  BVH *local_1c98;
  Intersectors *local_1c90;
  long local_1c88;
  long local_1c80;
  ulong local_1c78;
  RayK<4> *local_1c70;
  ulong local_1c68;
  ulong local_1c60;
  long local_1c58;
  long local_1c50;
  Scene *local_1c48;
  undefined1 local_1c40 [48];
  undefined1 local_1c10 [16];
  RTCFilterFunctionNArguments local_1c00;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1bd0;
  undefined1 local_1ba0 [16];
  undefined1 local_1b90 [16];
  undefined1 local_1b80 [16];
  undefined1 local_1b70 [16];
  undefined1 local_1b60 [8];
  float fStack_1b58;
  float fStack_1b54;
  undefined1 local_1b50 [8];
  float fStack_1b48;
  float fStack_1b44;
  undefined1 local_1b40 [16];
  undefined1 local_1b30 [16];
  undefined1 local_1b20 [16];
  undefined1 local_1b10 [16];
  undefined1 local_1b00 [16];
  float local_1af0 [4];
  undefined1 local_1ae0 [16];
  undefined1 local_1ad0 [16];
  undefined4 local_1ac0;
  undefined4 uStack_1abc;
  undefined4 uStack_1ab8;
  undefined4 uStack_1ab4;
  undefined1 local_1ab0 [16];
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined1 local_1a90 [16];
  uint local_1a80;
  uint uStack_1a7c;
  uint uStack_1a78;
  uint uStack_1a74;
  uint uStack_1a70;
  uint uStack_1a6c;
  uint uStack_1a68;
  uint uStack_1a64;
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [16];
  undefined1 local_1a10 [16];
  undefined1 local_1a00 [16];
  float local_19f0;
  float fStack_19ec;
  float fStack_19e8;
  float fStack_19e4;
  undefined1 local_19e0 [16];
  undefined1 local_19d0 [16];
  float local_19c0 [4];
  float fStack_19b0;
  float fStack_19ac;
  float fStack_19a8;
  float fStack_19a4;
  undefined1 local_19a0 [32];
  undefined1 local_1980 [32];
  undefined1 *local_1960;
  undefined1 local_1940 [32];
  undefined1 local_1920 [32];
  undefined1 local_1900 [32];
  undefined1 local_18e0 [32];
  float local_18c0 [4];
  float fStack_18b0;
  float fStack_18ac;
  float fStack_18a8;
  undefined4 uStack_18a4;
  float local_18a0 [4];
  float fStack_1890;
  float fStack_188c;
  float fStack_1888;
  undefined4 uStack_1884;
  float local_1880 [4];
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  undefined4 uStack_1864;
  undefined1 local_1860 [8];
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  undefined1 local_1840 [32];
  undefined1 local_1820 [32];
  undefined1 local_1800 [8];
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  undefined1 local_17e0 [8];
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined8 local_1700;
  size_t local_16f8;
  ulong local_16f0 [240];
  undefined4 local_f70;
  undefined4 uStack_f6c;
  undefined4 uStack_f68;
  undefined4 uStack_f64;
  undefined1 local_f60 [16];
  undefined1 local_f50 [3872];
  
  local_1c98 = (BVH *)This->ptr;
  if ((local_1c98->root).ptr != 8) {
    auVar102 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar155 = vpcmpeqd_avx(auVar102,(undefined1  [16])valid_i->field_0);
    auVar84 = ZEXT816(0) << 0x40;
    auVar91 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar84,5);
    auVar101 = auVar155 & auVar91;
    if ((((auVar101 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar101 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar101 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar101[0xf] < '\0'
       ) {
      local_1a20 = vandps_avx(auVar91,auVar155);
      local_1bd0._0_8_ = *(undefined8 *)ray;
      local_1bd0._8_8_ = *(undefined8 *)(ray + 8);
      local_1bd0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_1bd0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_1bd0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_1bd0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_1ba0 = *(undefined1 (*) [16])(ray + 0x40);
      local_1b90 = *(undefined1 (*) [16])(ray + 0x50);
      local_1b80 = *(undefined1 (*) [16])(ray + 0x60);
      auVar185._8_4_ = 0x7fffffff;
      auVar185._0_8_ = 0x7fffffff7fffffff;
      auVar185._12_4_ = 0x7fffffff;
      auVar91 = vandps_avx(local_1ba0,auVar185);
      auVar221._8_4_ = 0x219392ef;
      auVar221._0_8_ = 0x219392ef219392ef;
      auVar221._12_4_ = 0x219392ef;
      auVar155 = vcmpps_avx(auVar91,auVar221,1);
      auVar232._8_4_ = 0x3f800000;
      auVar232._0_8_ = &DAT_3f8000003f800000;
      auVar232._12_4_ = 0x3f800000;
      auVar156 = vdivps_avx(auVar232,local_1ba0);
      auVar91 = vandps_avx(local_1b90,auVar185);
      auVar101 = vcmpps_avx(auVar91,auVar221,1);
      auVar174 = vdivps_avx(auVar232,local_1b90);
      auVar91 = vandps_avx(local_1b80,auVar185);
      auVar91 = vcmpps_avx(auVar91,auVar221,1);
      auVar185 = vdivps_avx(auVar232,local_1b80);
      auVar222._8_4_ = 0x5d5e0b6b;
      auVar222._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar222._12_4_ = 0x5d5e0b6b;
      local_1b70 = vblendvps_avx(auVar156,auVar222,auVar155);
      _local_1b60 = vblendvps_avx(auVar174,auVar222,auVar101);
      _local_1b50 = vblendvps_avx(auVar185,auVar222,auVar91);
      auVar91 = vcmpps_avx(local_1b70,auVar84,1);
      auVar186._8_4_ = 0x10;
      auVar186._0_8_ = 0x1000000010;
      auVar186._12_4_ = 0x10;
      local_1b40 = vandps_avx(auVar91,auVar186);
      auVar91 = vcmpps_avx(_local_1b60,auVar84,5);
      auVar155._8_4_ = 0x20;
      auVar155._0_8_ = 0x2000000020;
      auVar155._12_4_ = 0x20;
      auVar187._8_4_ = 0x30;
      auVar187._0_8_ = 0x3000000030;
      auVar187._12_4_ = 0x30;
      local_1b30 = vblendvps_avx(auVar187,auVar155,auVar91);
      auVar91 = vcmpps_avx(_local_1b50,auVar84,5);
      auVar156._8_4_ = 0x40;
      auVar156._0_8_ = 0x4000000040;
      auVar156._12_4_ = 0x40;
      auVar174._8_4_ = 0x50;
      auVar174._0_8_ = 0x5000000050;
      auVar174._12_4_ = 0x50;
      local_1b20 = vblendvps_avx(auVar174,auVar156,auVar91);
      auVar91 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar84);
      auVar155 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar84);
      auVar101._8_4_ = 0x7f800000;
      auVar101._0_8_ = 0x7f8000007f800000;
      auVar101._12_4_ = 0x7f800000;
      local_1b10 = vblendvps_avx(auVar101,auVar91,local_1a20);
      auVar91._8_4_ = 0xff800000;
      auVar91._0_8_ = 0xff800000ff800000;
      auVar91._12_4_ = 0xff800000;
      local_1b00 = vblendvps_avx(auVar91,auVar155,local_1a20);
      local_1d70._4_4_ = local_1a20._4_4_ ^ auVar102._4_4_;
      local_1d70._0_4_ = local_1a20._0_4_ ^ auVar102._0_4_;
      local_1d70._8_4_ = local_1a20._8_4_ ^ auVar102._8_4_;
      local_1d70._12_4_ = local_1a20._12_4_ ^ auVar102._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar82 = 3;
      }
      else {
        uVar82 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1d28 = ray + 0x80;
      puVar72 = local_16f0;
      local_1700 = 0xfffffffffffffff8;
      pauVar73 = (undefined1 (*) [16])local_f50;
      local_f70 = 0x7f800000;
      uStack_f6c = 0x7f800000;
      uStack_f68 = 0x7f800000;
      uStack_f64 = 0x7f800000;
      local_16f8 = (local_1c98->root).ptr;
      local_f60 = local_1b10;
      local_1840._16_16_ = mm_lookupmask_ps._240_16_;
      local_1840._0_16_ = mm_lookupmask_ps._0_16_;
      auVar111 = ZEXT3264(local_1840);
      auVar129._8_4_ = 0x3f800000;
      auVar129._0_8_ = &DAT_3f8000003f800000;
      auVar129._12_4_ = 0x3f800000;
      auVar129._16_4_ = 0x3f800000;
      auVar129._20_4_ = 0x3f800000;
      auVar129._24_4_ = 0x3f800000;
      auVar129._28_4_ = 0x3f800000;
      auVar94._8_4_ = 0xbf800000;
      auVar94._0_8_ = 0xbf800000bf800000;
      auVar94._12_4_ = 0xbf800000;
      auVar94._16_4_ = 0xbf800000;
      auVar94._20_4_ = 0xbf800000;
      auVar94._24_4_ = 0xbf800000;
      auVar94._28_4_ = 0xbf800000;
      _local_1860 = vblendvps_avx(auVar129,auVar94,local_1840);
      local_1d90 = uVar82;
      local_1c90 = This;
      do {
        pauVar73 = pauVar73 + -1;
        local_1db0.ptr = puVar72[-1];
        puVar72 = puVar72 + -1;
        if (local_1db0.ptr == 0xfffffffffffffff8) {
LAB_0033a149:
          iVar63 = 3;
        }
        else {
          _local_1d60 = *pauVar73;
          auVar286 = ZEXT1664(_local_1d60);
          auVar91 = vcmpps_avx(_local_1d60,local_1b00,1);
          uVar62 = vmovmskps_avx(auVar91);
          if (uVar62 == 0) {
LAB_0033a15a:
            iVar63 = 2;
          }
          else {
            uVar74 = (ulong)(uVar62 & 0xff);
            uVar65 = (ulong)(uint)POPCOUNT(uVar62 & 0xff);
            iVar63 = 0;
            local_1dc0 = pauVar73;
            local_1db8 = puVar72;
            if (uVar65 <= uVar82) {
              do {
                k = 0;
                if (uVar74 != 0) {
                  for (; (uVar74 >> k & 1) == 0; k = k + 1) {
                  }
                }
                auVar111 = ZEXT1664(auVar111._0_16_);
                bVar83 = occluded1(local_1c90,local_1c98,local_1db0,k,&local_1da1,ray,
                                   (TravRayK<4,_true> *)&local_1bd0.field_0,context);
                if (bVar83) {
                  *(undefined4 *)(local_1d70 + k * 4) = 0xffffffff;
                }
                uVar74 = uVar74 & uVar74 - 1;
              } while (uVar74 != 0);
              auVar91 = _DAT_01febe20 & ~local_1d70;
              iVar63 = 3;
              auVar286 = ZEXT1664(_local_1d60);
              puVar72 = local_1db8;
              pauVar73 = local_1dc0;
              uVar82 = local_1d90;
              if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar91 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar91 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar91[0xf] < '\0') {
                auVar111 = ZEXT1664(local_1b00);
                auVar102._8_4_ = 0xff800000;
                auVar102._0_8_ = 0xff800000ff800000;
                auVar102._12_4_ = 0xff800000;
                local_1b00 = vblendvps_avx(local_1b00,auVar102,local_1d70);
                auVar286 = ZEXT1664(_local_1d60);
                iVar63 = 2;
              }
            }
            if (uVar82 < uVar65) {
              do {
                uVar62 = (uint)local_1db0.ptr;
                if ((local_1db0.ptr & 8) != 0) {
                  auVar91 = vpcmpeqd_avx(auVar111._0_16_,auVar111._0_16_);
                  auVar111 = ZEXT1664(auVar91);
                  if (local_1db0.ptr == 0xfffffffffffffff8) goto LAB_0033a149;
                  auVar102 = vcmpps_avx(local_1b00,auVar286._0_16_,6);
                  if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar102 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar102 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar102[0xf] < '\0') {
                    local_1c88 = (ulong)(uVar62 & 0xf) - 8;
                    auVar102 = local_1d70;
                    if (local_1c88 != 0) {
                      NVar71.ptr = local_1db0.ptr & 0xfffffffffffffff0;
                      local_1d10 = local_1d70 ^ auVar91;
                      lVar68 = 0;
                      local_1dc0 = pauVar73;
                      local_1db8 = puVar72;
                      local_1db0.ptr = NVar71.ptr;
                      local_1d20 = context;
                      local_1c70 = ray;
                      do {
                        lVar66 = lVar68 * 0x90;
                        auVar84._8_8_ = 0;
                        auVar84._0_8_ = *(ulong *)(NVar71.ptr + 0x20 + lVar66);
                        auVar103._8_8_ = 0;
                        auVar103._0_8_ = *(ulong *)(NVar71.ptr + 0x24 + lVar66);
                        auVar91 = vpminub_avx(auVar84,auVar103);
                        auVar102 = vpcmpeqb_avx(auVar84,auVar91);
                        auVar91 = vpcmpeqd_avx(auVar91,auVar91);
                        auVar102 = vpmovzxbd_avx(auVar102 ^ auVar91);
                        auVar102 = vpslld_avx(auVar102 ^ auVar91,0x1f);
                        uVar62 = vmovmskps_avx(auVar102);
                        local_1c80 = lVar68;
                        if (uVar62 != 0) {
                          lVar68 = NVar71.ptr + lVar66;
                          uVar69 = *(undefined4 *)(NVar71.ptr + 0x80 + lVar66);
                          auVar85._4_4_ = uVar69;
                          auVar85._0_4_ = uVar69;
                          auVar85._8_4_ = uVar69;
                          auVar85._12_4_ = uVar69;
                          auVar91 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar85);
                          fVar184 = *(float *)(NVar71.ptr + 0x84 + lVar66);
                          local_19f0 = fVar184 * auVar91._0_4_;
                          fStack_19ec = fVar184 * auVar91._4_4_;
                          fStack_19e8 = fVar184 * auVar91._8_4_;
                          fStack_19e4 = fVar184 * auVar91._12_4_;
                          uVar74 = (ulong)(uVar62 & 0xff);
                          local_1d88 = lVar68;
                          do {
                            auVar94 = _local_19c0;
                            lVar66 = 0;
                            if (uVar74 != 0) {
                              for (; (uVar74 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                              }
                            }
                            auVar86._8_8_ = 0;
                            auVar86._0_8_ = *(ulong *)(lVar68 + 0x20);
                            auVar91 = vpmovzxbd_avx(auVar86);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            fVar184 = *(float *)(lVar68 + 0x44);
                            fVar193 = *(float *)(lVar68 + 0x38);
                            local_19c0[1] = fVar193 + fVar184 * auVar91._4_4_;
                            local_19c0[0] = fVar193 + fVar184 * auVar91._0_4_;
                            local_19c0[2] = fVar193 + fVar184 * auVar91._8_4_;
                            _fStack_19b0 = auVar94._16_16_;
                            local_19c0[3] = fVar193 + fVar184 * auVar91._12_4_;
                            fVar131 = local_19c0[lVar66];
                            auVar139._8_8_ = 0;
                            auVar139._0_8_ = *(ulong *)(lVar68 + 0x50);
                            auVar91 = vpmovzxbd_avx(auVar139);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            fVar132 = *(float *)(lVar68 + 0x74);
                            fVar133 = *(float *)(lVar68 + 0x68);
                            local_1af0[0] = fVar133 + fVar132 * auVar91._0_4_;
                            local_1af0[1] = fVar133 + fVar132 * auVar91._4_4_;
                            local_1af0[2] = fVar133 + fVar132 * auVar91._8_4_;
                            local_1af0[3] = fVar133 + fVar132 * auVar91._12_4_;
                            auVar91 = vshufps_avx(ZEXT416((uint)(local_1af0[lVar66] - fVar131)),
                                                  ZEXT416((uint)(local_1af0[lVar66] - fVar131)),0);
                            auVar87._0_4_ = fVar131 + local_19f0 * auVar91._0_4_;
                            auVar87._4_4_ = fVar131 + fStack_19ec * auVar91._4_4_;
                            auVar87._8_4_ = fVar131 + fStack_19e8 * auVar91._8_4_;
                            auVar87._12_4_ = fVar131 + fStack_19e4 * auVar91._12_4_;
                            auVar140._8_8_ = 0;
                            auVar140._0_8_ = *(ulong *)(lVar68 + 0x24);
                            auVar91 = vpmovzxbd_avx(auVar140);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            local_19c0[1] = fVar193 + fVar184 * auVar91._4_4_;
                            local_19c0[0] = fVar193 + fVar184 * auVar91._0_4_;
                            local_19c0[2] = fVar193 + fVar184 * auVar91._8_4_;
                            local_19c0[3] = fVar193 + fVar184 * auVar91._12_4_;
                            fVar184 = local_19c0[lVar66];
                            auVar121._8_8_ = 0;
                            auVar121._0_8_ = *(ulong *)(lVar68 + 0x54);
                            auVar91 = vpmovzxbd_avx(auVar121);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            local_1af0[0] = fVar133 + fVar132 * auVar91._0_4_;
                            local_1af0[1] = fVar133 + fVar132 * auVar91._4_4_;
                            local_1af0[2] = fVar133 + fVar132 * auVar91._8_4_;
                            local_1af0[3] = fVar133 + fVar132 * auVar91._12_4_;
                            auVar91 = vshufps_avx(ZEXT416((uint)(local_1af0[lVar66] - fVar184)),
                                                  ZEXT416((uint)(local_1af0[lVar66] - fVar184)),0);
                            auVar104._0_4_ = fVar184 + local_19f0 * auVar91._0_4_;
                            auVar104._4_4_ = fVar184 + fStack_19ec * auVar91._4_4_;
                            auVar104._8_4_ = fVar184 + fStack_19e8 * auVar91._8_4_;
                            auVar104._12_4_ = fVar184 + fStack_19e4 * auVar91._12_4_;
                            auVar122._8_8_ = 0;
                            auVar122._0_8_ = *(ulong *)(lVar68 + 0x28);
                            auVar91 = vpmovzxbd_avx(auVar122);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            fVar184 = *(float *)(lVar68 + 0x48);
                            fVar193 = *(float *)(lVar68 + 0x3c);
                            local_19c0[1] = fVar193 + fVar184 * auVar91._4_4_;
                            local_19c0[0] = fVar193 + fVar184 * auVar91._0_4_;
                            local_19c0[2] = fVar193 + fVar184 * auVar91._8_4_;
                            local_19c0[3] = fVar193 + fVar184 * auVar91._12_4_;
                            fVar131 = local_19c0[lVar66];
                            auVar178._8_8_ = 0;
                            auVar178._0_8_ = *(ulong *)(lVar68 + 0x58);
                            auVar91 = vpmovzxbd_avx(auVar178);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            fVar132 = *(float *)(lVar68 + 0x78);
                            fVar133 = *(float *)(lVar68 + 0x6c);
                            local_1af0[0] = fVar133 + fVar132 * auVar91._0_4_;
                            local_1af0[1] = fVar133 + fVar132 * auVar91._4_4_;
                            local_1af0[2] = fVar133 + fVar132 * auVar91._8_4_;
                            local_1af0[3] = fVar133 + fVar132 * auVar91._12_4_;
                            auVar91 = vshufps_avx(ZEXT416((uint)(local_1af0[lVar66] - fVar131)),
                                                  ZEXT416((uint)(local_1af0[lVar66] - fVar131)),0);
                            auVar123._0_4_ = fVar131 + local_19f0 * auVar91._0_4_;
                            auVar123._4_4_ = fVar131 + fStack_19ec * auVar91._4_4_;
                            auVar123._8_4_ = fVar131 + fStack_19e8 * auVar91._8_4_;
                            auVar123._12_4_ = fVar131 + fStack_19e4 * auVar91._12_4_;
                            auVar179._8_8_ = 0;
                            auVar179._0_8_ = *(ulong *)(lVar68 + 0x2c);
                            auVar91 = vpmovzxbd_avx(auVar179);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            local_19c0[1] = fVar193 + fVar184 * auVar91._4_4_;
                            local_19c0[0] = fVar193 + fVar184 * auVar91._0_4_;
                            local_19c0[2] = fVar193 + fVar184 * auVar91._8_4_;
                            local_19c0[3] = fVar193 + fVar184 * auVar91._12_4_;
                            fVar184 = local_19c0[lVar66];
                            auVar161._8_8_ = 0;
                            auVar161._0_8_ = *(ulong *)(lVar68 + 0x5c);
                            auVar91 = vpmovzxbd_avx(auVar161);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            local_1af0[0] = fVar133 + fVar132 * auVar91._0_4_;
                            local_1af0[1] = fVar133 + fVar132 * auVar91._4_4_;
                            local_1af0[2] = fVar133 + fVar132 * auVar91._8_4_;
                            local_1af0[3] = fVar133 + fVar132 * auVar91._12_4_;
                            auVar91 = vshufps_avx(ZEXT416((uint)(local_1af0[lVar66] - fVar184)),
                                                  ZEXT416((uint)(local_1af0[lVar66] - fVar184)),0);
                            auVar141._0_4_ = fVar184 + local_19f0 * auVar91._0_4_;
                            auVar141._4_4_ = fVar184 + fStack_19ec * auVar91._4_4_;
                            auVar141._8_4_ = fVar184 + fStack_19e8 * auVar91._8_4_;
                            auVar141._12_4_ = fVar184 + fStack_19e4 * auVar91._12_4_;
                            auVar162._8_8_ = 0;
                            auVar162._0_8_ = *(ulong *)(lVar68 + 0x30);
                            auVar91 = vpmovzxbd_avx(auVar162);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            fVar184 = *(float *)(lVar68 + 0x4c);
                            fVar193 = *(float *)(lVar68 + 0x40);
                            local_19c0[1] = fVar193 + fVar184 * auVar91._4_4_;
                            local_19c0[0] = fVar193 + fVar184 * auVar91._0_4_;
                            local_19c0[2] = fVar193 + fVar184 * auVar91._8_4_;
                            local_19c0[3] = fVar193 + fVar184 * auVar91._12_4_;
                            fVar131 = local_19c0[lVar66];
                            auVar202._8_8_ = 0;
                            auVar202._0_8_ = *(ulong *)(lVar68 + 0x60);
                            auVar91 = vpmovzxbd_avx(auVar202);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            fVar132 = *(float *)(lVar68 + 0x7c);
                            fVar133 = *(float *)(lVar68 + 0x70);
                            local_1af0[0] = fVar133 + fVar132 * auVar91._0_4_;
                            local_1af0[1] = fVar133 + fVar132 * auVar91._4_4_;
                            local_1af0[2] = fVar133 + fVar132 * auVar91._8_4_;
                            local_1af0[3] = fVar133 + fVar132 * auVar91._12_4_;
                            auVar91 = vshufps_avx(ZEXT416((uint)(local_1af0[lVar66] - fVar131)),
                                                  ZEXT416((uint)(local_1af0[lVar66] - fVar131)),0);
                            auVar163._0_4_ = fVar131 + local_19f0 * auVar91._0_4_;
                            auVar163._4_4_ = fVar131 + fStack_19ec * auVar91._4_4_;
                            auVar163._8_4_ = fVar131 + fStack_19e8 * auVar91._8_4_;
                            auVar163._12_4_ = fVar131 + fStack_19e4 * auVar91._12_4_;
                            auVar203._8_8_ = 0;
                            auVar203._0_8_ = *(ulong *)(lVar68 + 0x34);
                            auVar91 = vpmovzxbd_avx(auVar203);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            local_19c0[1] = fVar193 + fVar184 * auVar91._4_4_;
                            local_19c0[0] = fVar193 + fVar184 * auVar91._0_4_;
                            local_19c0[2] = fVar193 + fVar184 * auVar91._8_4_;
                            local_19c0[3] = fVar193 + fVar184 * auVar91._12_4_;
                            fVar184 = local_19c0[lVar66];
                            auVar189._8_8_ = 0;
                            auVar189._0_8_ = *(ulong *)(lVar68 + 100);
                            auVar91 = vpmovzxbd_avx(auVar189);
                            auVar91 = vcvtdq2ps_avx(auVar91);
                            local_1af0[0] = fVar133 + fVar132 * auVar91._0_4_;
                            local_1af0[1] = fVar133 + fVar132 * auVar91._4_4_;
                            local_1af0[2] = fVar133 + fVar132 * auVar91._8_4_;
                            local_1af0[3] = fVar133 + fVar132 * auVar91._12_4_;
                            auVar91 = vshufps_avx(ZEXT416((uint)(local_1af0[lVar66] - fVar184)),
                                                  ZEXT416((uint)(local_1af0[lVar66] - fVar184)),0);
                            auVar180._0_4_ = fVar184 + local_19f0 * auVar91._0_4_;
                            auVar180._4_4_ = fVar184 + fStack_19ec * auVar91._4_4_;
                            auVar180._8_4_ = fVar184 + fStack_19e8 * auVar91._8_4_;
                            auVar180._12_4_ = fVar184 + fStack_19e4 * auVar91._12_4_;
                            auVar57._8_8_ = local_1bd0._8_8_;
                            auVar57._0_8_ = local_1bd0._0_8_;
                            auVar59._8_8_ = local_1bd0._24_8_;
                            auVar59._0_8_ = local_1bd0._16_8_;
                            auVar61._8_8_ = local_1bd0._40_8_;
                            auVar61._0_8_ = local_1bd0._32_8_;
                            auVar91 = vsubps_avx(auVar87,auVar57);
                            auVar88._0_4_ = local_1b70._0_4_ * auVar91._0_4_;
                            auVar88._4_4_ = local_1b70._4_4_ * auVar91._4_4_;
                            auVar88._8_4_ = local_1b70._8_4_ * auVar91._8_4_;
                            auVar88._12_4_ = local_1b70._12_4_ * auVar91._12_4_;
                            auVar91 = vsubps_avx(auVar123,auVar59);
                            auVar124._0_4_ = local_1b60._0_4_ * auVar91._0_4_;
                            auVar124._4_4_ = local_1b60._4_4_ * auVar91._4_4_;
                            auVar124._8_4_ = local_1b60._8_4_ * auVar91._8_4_;
                            auVar124._12_4_ = local_1b60._12_4_ * auVar91._12_4_;
                            auVar91 = vsubps_avx(auVar163,auVar61);
                            auVar164._0_4_ = local_1b50._0_4_ * auVar91._0_4_;
                            auVar164._4_4_ = local_1b50._4_4_ * auVar91._4_4_;
                            auVar164._8_4_ = local_1b50._8_4_ * auVar91._8_4_;
                            auVar164._12_4_ = local_1b50._12_4_ * auVar91._12_4_;
                            auVar91 = vsubps_avx(auVar104,auVar57);
                            auVar105._0_4_ = local_1b70._0_4_ * auVar91._0_4_;
                            auVar105._4_4_ = local_1b70._4_4_ * auVar91._4_4_;
                            auVar105._8_4_ = local_1b70._8_4_ * auVar91._8_4_;
                            auVar105._12_4_ = local_1b70._12_4_ * auVar91._12_4_;
                            auVar91 = vsubps_avx(auVar141,auVar59);
                            auVar142._0_4_ = local_1b60._0_4_ * auVar91._0_4_;
                            auVar142._4_4_ = local_1b60._4_4_ * auVar91._4_4_;
                            auVar142._8_4_ = local_1b60._8_4_ * auVar91._8_4_;
                            auVar142._12_4_ = local_1b60._12_4_ * auVar91._12_4_;
                            auVar91 = vsubps_avx(auVar180,auVar61);
                            auVar181._0_4_ = local_1b50._0_4_ * auVar91._0_4_;
                            auVar181._4_4_ = local_1b50._4_4_ * auVar91._4_4_;
                            auVar181._8_4_ = local_1b50._8_4_ * auVar91._8_4_;
                            auVar181._12_4_ = local_1b50._12_4_ * auVar91._12_4_;
                            auVar91 = vminps_avx(auVar88,auVar105);
                            auVar102 = vminps_avx(auVar124,auVar142);
                            auVar91 = vmaxps_avx(auVar91,auVar102);
                            auVar102 = vminps_avx(auVar164,auVar181);
                            auVar91 = vmaxps_avx(auVar91,auVar102);
                            auVar190._0_4_ = auVar91._0_4_ * 0.99999964;
                            auVar190._4_4_ = auVar91._4_4_ * 0.99999964;
                            auVar190._8_4_ = auVar91._8_4_ * 0.99999964;
                            auVar190._12_4_ = auVar91._12_4_ * 0.99999964;
                            auVar91 = vmaxps_avx(auVar88,auVar105);
                            auVar102 = vmaxps_avx(auVar124,auVar142);
                            auVar102 = vminps_avx(auVar91,auVar102);
                            auVar91 = vmaxps_avx(auVar164,auVar181);
                            auVar91 = vminps_avx(auVar102,auVar91);
                            auVar89._0_4_ = auVar91._0_4_ * 1.0000004;
                            auVar89._4_4_ = auVar91._4_4_ * 1.0000004;
                            auVar89._8_4_ = auVar91._8_4_ * 1.0000004;
                            auVar89._12_4_ = auVar91._12_4_ * 1.0000004;
                            auVar91 = vmaxps_avx(auVar190,local_1b10);
                            auVar102 = vminps_avx(auVar89,local_1b00);
                            auVar91 = vcmpps_avx(auVar91,auVar102,2);
                            auVar91 = local_1d10 & auVar91;
                            local_1c78 = uVar74;
                            if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 && (auVar91 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && -1 < auVar91[0xf]) {
                              bVar83 = false;
                              auVar102 = local_1d10;
                              auVar91 = local_1d10;
                            }
                            else {
                              uVar2 = *(ushort *)(lVar68 + lVar66 * 8);
                              local_1d94 = (uint)*(ushort *)(lVar68 + 2 + lVar66 * 8);
                              uVar62 = *(uint *)(lVar68 + 0x88);
                              uVar3 = *(uint *)(lVar68 + 4 + lVar66 * 8);
                              local_1d18 = (ulong)uVar3;
                              local_1c10 = local_1d10;
                              uVar64 = vmovmskps_avx(local_1d10);
                              if (uVar64 != 0) {
                                uVar74 = (ulong)(uVar64 & 0xff);
                                local_1d74 = uVar2 & 0x7fff;
                                local_1d78 = local_1d94 & 0x7fff;
                                local_1c68 = (ulong)(-1 < (short)uVar2);
                                auVar91 = vpshufd_avx(ZEXT416(local_1d74),0);
                                auVar91 = vpaddd_avx(auVar91,_DAT_0201c990);
                                auVar102 = vpshufd_avx(ZEXT416(local_1d78),0);
                                auVar102 = vpaddd_avx(auVar102,_DAT_0201c9a0);
                                auVar95._16_16_ = auVar91;
                                auVar95._0_16_ = auVar91;
                                _local_17e0 = vcvtdq2ps_avx(auVar95);
                                auVar96._16_16_ = auVar102;
                                auVar96._0_16_ = auVar102;
                                _local_1800 = vcvtdq2ps_avx(auVar96);
                                local_1a00 = vpshufd_avx(ZEXT416(uVar62),0);
                                local_1a10 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
                                pRVar79 = context;
                                pRVar80 = ray;
                                uVar65 = (ulong)uVar62;
                                local_1c60 = (ulong)uVar62;
                                do {
                                  uVar4 = local_1c60;
                                  ray = local_1c70;
                                  context = local_1d20;
                                  lVar68 = local_1d88;
                                  uVar82 = local_1d90;
                                  lVar66 = 0;
                                  if (uVar74 != 0) {
                                    for (; (uVar74 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                                    }
                                  }
                                  local_1c48 = pRVar79->scene;
                                  pGVar75 = (local_1c48->geometries).items[uVar65].ptr;
                                  local_1c50 = *(long *)&pGVar75->field_0x58;
                                  local_1c58 = pGVar75[1].super_RefCount.refCounter.
                                               super___atomic_base<unsigned_long>._M_i * local_1d18;
                                  fVar184 = (pGVar75->time_range).lower;
                                  auVar90._4_4_ = fVar184;
                                  auVar90._0_4_ = fVar184;
                                  auVar90._8_4_ = fVar184;
                                  auVar90._12_4_ = fVar184;
                                  fVar193 = pGVar75->fnumTimeSegments;
                                  auVar102 = vsubps_avx(*(undefined1 (*) [16])(pRVar80 + 0x70),
                                                        auVar90);
                                  auVar91 = ZEXT416((uint)((pGVar75->time_range).upper - fVar184));
                                  auVar91 = vshufps_avx(auVar91,auVar91,0);
                                  auVar91 = vdivps_avx(auVar102,auVar91);
                                  auVar92._0_4_ = fVar193 * auVar91._0_4_;
                                  auVar92._4_4_ = fVar193 * auVar91._4_4_;
                                  auVar92._8_4_ = fVar193 * auVar91._8_4_;
                                  auVar92._12_4_ = fVar193 * auVar91._12_4_;
                                  auVar91 = vroundps_avx(auVar92,1);
                                  auVar102 = vshufps_avx(ZEXT416((uint)(fVar193 + -1.0)),
                                                         ZEXT416((uint)(fVar193 + -1.0)),0);
                                  auVar91 = vminps_avx(auVar91,auVar102);
                                  auVar91 = vmaxps_avx(auVar91,_DAT_01feba10);
                                  local_19d0 = vsubps_avx(auVar92,auVar91);
                                  local_19e0 = vcvtps2dq_avx(auVar91);
                                  uVar62 = *(uint *)(local_1c50 + 4 + local_1c58);
                                  uVar78 = (ulong)uVar62;
                                  uVar76 = (ulong)(uVar62 * local_1d78 +
                                                  *(int *)(local_1c50 + local_1c58) + local_1d74);
                                  lVar5 = *(long *)&pGVar75[2].numPrimitives;
                                  lVar70 = (long)*(int *)(local_19e0 + lVar66 * 4) * 0x38;
                                  lVar6 = *(long *)(lVar5 + lVar70);
                                  lVar7 = *(long *)(lVar5 + 0x10 + lVar70);
                                  lVar8 = *(long *)(lVar5 + 0x48 + lVar70);
                                  auVar91 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar76);
                                  auVar102 = *(undefined1 (*) [16])(lVar6 + (uVar76 + 1) * lVar7);
                                  lVar1 = uVar76 + uVar78;
                                  auVar156 = *(undefined1 (*) [16])(lVar6 + lVar1 * lVar7);
                                  lVar81 = uVar76 + uVar78 + 1;
                                  auVar155 = *(undefined1 (*) [16])(lVar6 + lVar81 * lVar7);
                                  lVar67 = uVar76 + local_1c68 + 1;
                                  lVar77 = lVar8 * lVar67;
                                  auVar101 = *(undefined1 (*) [16])(lVar6 + lVar67 * lVar7);
                                  lVar67 = lVar81 + local_1c68;
                                  auVar84 = *(undefined1 (*) [16])(lVar6 + lVar67 * lVar7);
                                  uVar65 = 0;
                                  if (-1 < (short)local_1d94) {
                                    uVar65 = uVar78;
                                  }
                                  auVar174 = *(undefined1 (*) [16])
                                              (lVar6 + (lVar1 + uVar65) * lVar7);
                                  auVar185 = *(undefined1 (*) [16])
                                              (lVar6 + (lVar81 + uVar65) * lVar7);
                                  auVar186 = *(undefined1 (*) [16])
                                              (lVar6 + lVar7 * (uVar65 + lVar67));
                                  lVar5 = *(long *)(lVar5 + 0x38 + lVar70);
                                  fVar184 = local_19c0[lVar66 + -4];
                                  auVar187 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar5 + lVar8 * uVar76),auVar91);
                                  auVar125._0_4_ = fVar184 * auVar187._0_4_ + auVar91._0_4_;
                                  auVar125._4_4_ = fVar184 * auVar187._4_4_ + auVar91._4_4_;
                                  auVar125._8_4_ = fVar184 * auVar187._8_4_ + auVar91._8_4_;
                                  auVar125._12_4_ = fVar184 * auVar187._12_4_ + auVar91._12_4_;
                                  auVar91 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar5 + lVar8 * (uVar76 + 1)),auVar102);
                                  auVar233._0_4_ = fVar184 * auVar91._0_4_ + auVar102._0_4_;
                                  auVar233._4_4_ = fVar184 * auVar91._4_4_ + auVar102._4_4_;
                                  auVar233._8_4_ = fVar184 * auVar91._8_4_ + auVar102._8_4_;
                                  auVar233._12_4_ = fVar184 * auVar91._12_4_ + auVar102._12_4_;
                                  auVar91 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar8 * lVar1)
                                                       ,auVar156);
                                  auVar93._0_4_ = fVar184 * auVar91._0_4_ + auVar156._0_4_;
                                  auVar93._4_4_ = fVar184 * auVar91._4_4_ + auVar156._4_4_;
                                  auVar93._8_4_ = fVar184 * auVar91._8_4_ + auVar156._8_4_;
                                  auVar93._12_4_ = fVar184 * auVar91._12_4_ + auVar156._12_4_;
                                  auVar91 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar5 + lVar8 * lVar81),auVar155);
                                  auVar106._0_4_ = fVar184 * auVar91._0_4_ + auVar155._0_4_;
                                  auVar106._4_4_ = fVar184 * auVar91._4_4_ + auVar155._4_4_;
                                  auVar106._8_4_ = fVar184 * auVar91._8_4_ + auVar155._8_4_;
                                  auVar106._12_4_ = fVar184 * auVar91._12_4_ + auVar155._12_4_;
                                  auVar91 = vsubps_avx(*(undefined1 (*) [16])(lVar5 + lVar77),
                                                       auVar101);
                                  auVar165._0_4_ = fVar184 * auVar91._0_4_ + auVar101._0_4_;
                                  auVar165._4_4_ = fVar184 * auVar91._4_4_ + auVar101._4_4_;
                                  auVar165._8_4_ = fVar184 * auVar91._8_4_ + auVar101._8_4_;
                                  auVar165._12_4_ = fVar184 * auVar91._12_4_ + auVar101._12_4_;
                                  auVar91 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar5 + lVar8 * lVar67),auVar84);
                                  auVar182._0_4_ = fVar184 * auVar91._0_4_ + auVar84._0_4_;
                                  auVar182._4_4_ = fVar184 * auVar91._4_4_ + auVar84._4_4_;
                                  auVar182._8_4_ = fVar184 * auVar91._8_4_ + auVar84._8_4_;
                                  auVar182._12_4_ = fVar184 * auVar91._12_4_ + auVar84._12_4_;
                                  auVar91 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar5 + lVar8 * (lVar1 + uVar65)),auVar174)
                                  ;
                                  auVar143._0_4_ = auVar174._0_4_ + fVar184 * auVar91._0_4_;
                                  auVar143._4_4_ = auVar174._4_4_ + fVar184 * auVar91._4_4_;
                                  auVar143._8_4_ = auVar174._8_4_ + fVar184 * auVar91._8_4_;
                                  auVar143._12_4_ = auVar174._12_4_ + fVar184 * auVar91._12_4_;
                                  auVar91 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar5 + lVar8 * (lVar81 + uVar65)),auVar185
                                                      );
                                  auVar191._0_4_ = auVar185._0_4_ + fVar184 * auVar91._0_4_;
                                  auVar191._4_4_ = auVar185._4_4_ + fVar184 * auVar91._4_4_;
                                  auVar191._8_4_ = auVar185._8_4_ + fVar184 * auVar91._8_4_;
                                  auVar191._12_4_ = auVar185._12_4_ + fVar184 * auVar91._12_4_;
                                  auVar91 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar5 + (uVar65 + lVar67) * lVar8),auVar186
                                                      );
                                  auVar204._0_4_ = auVar186._0_4_ + fVar184 * auVar91._0_4_;
                                  auVar204._4_4_ = auVar186._4_4_ + fVar184 * auVar91._4_4_;
                                  auVar204._8_4_ = auVar186._8_4_ + fVar184 * auVar91._8_4_;
                                  auVar204._12_4_ = auVar186._12_4_ + fVar184 * auVar91._12_4_;
                                  auVar155 = vunpcklps_avx(auVar125,auVar106);
                                  auVar91 = vunpckhps_avx(auVar125,auVar106);
                                  auVar101 = vunpcklps_avx(auVar233,auVar93);
                                  auVar102 = vunpckhps_avx(auVar233,auVar93);
                                  auVar156 = vunpcklps_avx(auVar91,auVar102);
                                  auVar174 = vunpcklps_avx(auVar155,auVar101);
                                  auVar91 = vunpckhps_avx(auVar155,auVar101);
                                  auVar101 = vunpcklps_avx(auVar233,auVar182);
                                  auVar102 = vunpckhps_avx(auVar233,auVar182);
                                  auVar84 = vunpcklps_avx(auVar165,auVar106);
                                  auVar155 = vunpckhps_avx(auVar165,auVar106);
                                  auVar185 = vunpcklps_avx(auVar102,auVar155);
                                  auVar186 = vunpcklps_avx(auVar101,auVar84);
                                  auVar102 = vunpckhps_avx(auVar101,auVar84);
                                  auVar84 = vunpcklps_avx(auVar106,auVar204);
                                  auVar155 = vunpckhps_avx(auVar106,auVar204);
                                  auVar187 = vunpcklps_avx(auVar182,auVar191);
                                  auVar101 = vunpckhps_avx(auVar182,auVar191);
                                  auVar221 = vunpcklps_avx(auVar155,auVar101);
                                  auVar222 = vunpcklps_avx(auVar84,auVar187);
                                  auVar155 = vunpckhps_avx(auVar84,auVar187);
                                  auVar187 = vunpcklps_avx(auVar93,auVar191);
                                  auVar101 = vunpckhps_avx(auVar93,auVar191);
                                  auVar232 = vunpcklps_avx(auVar106,auVar143);
                                  auVar84 = vunpckhps_avx(auVar106,auVar143);
                                  auVar84 = vunpcklps_avx(auVar101,auVar84);
                                  auVar103 = vunpcklps_avx(auVar187,auVar232);
                                  auVar101 = vunpckhps_avx(auVar187,auVar232);
                                  auVar192._16_16_ = auVar222;
                                  auVar192._0_16_ = auVar174;
                                  auVar205._16_16_ = auVar155;
                                  auVar205._0_16_ = auVar91;
                                  auVar130._16_16_ = auVar221;
                                  auVar130._0_16_ = auVar156;
                                  auVar223._16_16_ = auVar186;
                                  auVar223._0_16_ = auVar186;
                                  auVar234._16_16_ = auVar102;
                                  auVar234._0_16_ = auVar102;
                                  auVar166._16_16_ = auVar185;
                                  auVar166._0_16_ = auVar185;
                                  auVar241._16_16_ = auVar103;
                                  auVar241._0_16_ = auVar103;
                                  auVar144._16_16_ = auVar101;
                                  auVar144._0_16_ = auVar101;
                                  auVar285._16_16_ = auVar84;
                                  auVar285._0_16_ = auVar84;
                                  local_1960 = &local_1dc1;
                                  uVar69 = *(undefined4 *)(local_1c70 + lVar66 * 4);
                                  auVar258._4_4_ = uVar69;
                                  auVar258._0_4_ = uVar69;
                                  auVar258._8_4_ = uVar69;
                                  auVar258._12_4_ = uVar69;
                                  auVar258._16_4_ = uVar69;
                                  auVar258._20_4_ = uVar69;
                                  auVar258._24_4_ = uVar69;
                                  auVar258._28_4_ = uVar69;
                                  uVar69 = *(undefined4 *)(local_1c70 + lVar66 * 4 + 0x10);
                                  auVar267._4_4_ = uVar69;
                                  auVar267._0_4_ = uVar69;
                                  auVar267._8_4_ = uVar69;
                                  auVar267._12_4_ = uVar69;
                                  auVar267._16_4_ = uVar69;
                                  auVar267._20_4_ = uVar69;
                                  auVar267._24_4_ = uVar69;
                                  auVar267._28_4_ = uVar69;
                                  uVar69 = *(undefined4 *)(local_1c70 + lVar66 * 4 + 0x20);
                                  auVar271._4_4_ = uVar69;
                                  auVar271._0_4_ = uVar69;
                                  auVar271._8_4_ = uVar69;
                                  auVar271._12_4_ = uVar69;
                                  auVar271._16_4_ = uVar69;
                                  auVar271._20_4_ = uVar69;
                                  auVar271._24_4_ = uVar69;
                                  auVar271._28_4_ = uVar69;
                                  local_1a40 = vsubps_avx(auVar192,auVar258);
                                  local_1a60 = vsubps_avx(auVar205,auVar267);
                                  local_1720 = vsubps_avx(auVar130,auVar271);
                                  auVar94 = vsubps_avx(auVar223,auVar258);
                                  auVar129 = vsubps_avx(auVar234,auVar267);
                                  auVar96 = vsubps_avx(auVar166,auVar271);
                                  auVar95 = vsubps_avx(auVar241,auVar258);
                                  auVar19 = vsubps_avx(auVar144,auVar267);
                                  auVar20 = vsubps_avx(auVar285,auVar271);
                                  local_1740 = vsubps_avx(auVar95,local_1a40);
                                  local_1760 = vsubps_avx(auVar19,local_1a60);
                                  local_1780 = vsubps_avx(auVar20,local_1720);
                                  fVar131 = local_1a60._0_4_;
                                  fVar184 = auVar19._0_4_ + fVar131;
                                  fVar134 = local_1a60._4_4_;
                                  fVar193 = auVar19._4_4_ + fVar134;
                                  fVar147 = local_1a60._8_4_;
                                  fVar194 = auVar19._8_4_ + fVar147;
                                  fVar150 = local_1a60._12_4_;
                                  fVar195 = auVar19._12_4_ + fVar150;
                                  fVar10 = local_1a60._16_4_;
                                  fVar196 = auVar19._16_4_ + fVar10;
                                  fVar13 = local_1a60._20_4_;
                                  fVar197 = auVar19._20_4_ + fVar13;
                                  fVar16 = local_1a60._24_4_;
                                  fVar198 = auVar19._24_4_ + fVar16;
                                  fVar154 = local_1a60._28_4_;
                                  fVar132 = local_1720._0_4_;
                                  fVar199 = auVar20._0_4_ + fVar132;
                                  fVar135 = local_1720._4_4_;
                                  fVar208 = auVar20._4_4_ + fVar135;
                                  fVar148 = local_1720._8_4_;
                                  fVar210 = auVar20._8_4_ + fVar148;
                                  fVar151 = local_1720._12_4_;
                                  fVar212 = auVar20._12_4_ + fVar151;
                                  fVar11 = local_1720._16_4_;
                                  fVar214 = auVar20._16_4_ + fVar11;
                                  fVar14 = local_1720._20_4_;
                                  fVar216 = auVar20._20_4_ + fVar14;
                                  fVar17 = local_1720._24_4_;
                                  fVar218 = auVar20._24_4_ + fVar17;
                                  fVar152 = auVar20._28_4_;
                                  fVar112 = local_1780._0_4_;
                                  fVar113 = local_1780._4_4_;
                                  auVar21._4_4_ = fVar193 * fVar113;
                                  auVar21._0_4_ = fVar184 * fVar112;
                                  fVar114 = local_1780._8_4_;
                                  auVar21._8_4_ = fVar194 * fVar114;
                                  fVar115 = local_1780._12_4_;
                                  auVar21._12_4_ = fVar195 * fVar115;
                                  fVar116 = local_1780._16_4_;
                                  auVar21._16_4_ = fVar196 * fVar116;
                                  fVar117 = local_1780._20_4_;
                                  auVar21._20_4_ = fVar197 * fVar117;
                                  fVar118 = local_1780._24_4_;
                                  auVar21._24_4_ = fVar198 * fVar118;
                                  auVar21._28_4_ = auVar102._12_4_;
                                  fVar268 = local_1760._0_4_;
                                  fVar272 = local_1760._4_4_;
                                  auVar22._4_4_ = fVar272 * fVar208;
                                  auVar22._0_4_ = fVar268 * fVar199;
                                  fVar274 = local_1760._8_4_;
                                  auVar22._8_4_ = fVar274 * fVar210;
                                  fVar276 = local_1760._12_4_;
                                  auVar22._12_4_ = fVar276 * fVar212;
                                  fVar278 = local_1760._16_4_;
                                  auVar22._16_4_ = fVar278 * fVar214;
                                  fVar280 = local_1760._20_4_;
                                  auVar22._20_4_ = fVar280 * fVar216;
                                  fVar282 = local_1760._24_4_;
                                  auVar22._24_4_ = fVar282 * fVar218;
                                  auVar22._28_4_ = auVar103._12_4_;
                                  auVar21 = vsubps_avx(auVar22,auVar21);
                                  fVar133 = local_1a40._0_4_;
                                  fVar231 = auVar95._0_4_ + fVar133;
                                  fVar146 = local_1a40._4_4_;
                                  fVar235 = auVar95._4_4_ + fVar146;
                                  fVar149 = local_1a40._8_4_;
                                  fVar236 = auVar95._8_4_ + fVar149;
                                  fVar153 = local_1a40._12_4_;
                                  fVar237 = auVar95._12_4_ + fVar153;
                                  fVar12 = local_1a40._16_4_;
                                  fVar238 = auVar95._16_4_ + fVar12;
                                  fVar15 = local_1a40._20_4_;
                                  fVar239 = auVar95._20_4_ + fVar15;
                                  fVar18 = local_1a40._24_4_;
                                  fVar240 = auVar95._24_4_ + fVar18;
                                  fVar256 = local_1740._0_4_;
                                  fVar259 = local_1740._4_4_;
                                  auVar23._4_4_ = fVar259 * fVar208;
                                  auVar23._0_4_ = fVar256 * fVar199;
                                  fVar260 = local_1740._8_4_;
                                  auVar23._8_4_ = fVar260 * fVar210;
                                  fVar261 = local_1740._12_4_;
                                  auVar23._12_4_ = fVar261 * fVar212;
                                  fVar262 = local_1740._16_4_;
                                  auVar23._16_4_ = fVar262 * fVar214;
                                  fVar263 = local_1740._20_4_;
                                  auVar23._20_4_ = fVar263 * fVar216;
                                  fVar264 = local_1740._24_4_;
                                  auVar23._24_4_ = fVar264 * fVar218;
                                  auVar23._28_4_ = fVar152 + local_1720._28_4_;
                                  auVar130 = local_1780;
                                  auVar24._4_4_ = fVar235 * fVar113;
                                  auVar24._0_4_ = fVar231 * fVar112;
                                  auVar24._8_4_ = fVar236 * fVar114;
                                  auVar24._12_4_ = fVar237 * fVar115;
                                  auVar24._16_4_ = fVar238 * fVar116;
                                  auVar24._20_4_ = fVar239 * fVar117;
                                  auVar24._24_4_ = fVar240 * fVar118;
                                  auVar24._28_4_ = auVar103._12_4_;
                                  auVar22 = vsubps_avx(auVar24,auVar23);
                                  auVar25._4_4_ = fVar235 * fVar272;
                                  auVar25._0_4_ = fVar231 * fVar268;
                                  auVar25._8_4_ = fVar236 * fVar274;
                                  auVar25._12_4_ = fVar237 * fVar276;
                                  auVar25._16_4_ = fVar238 * fVar278;
                                  auVar25._20_4_ = fVar239 * fVar280;
                                  auVar25._24_4_ = fVar240 * fVar282;
                                  auVar25._28_4_ = auVar95._28_4_ + local_1a40._28_4_;
                                  auVar26._4_4_ = fVar259 * fVar193;
                                  auVar26._0_4_ = fVar256 * fVar184;
                                  auVar26._8_4_ = fVar260 * fVar194;
                                  auVar26._12_4_ = fVar261 * fVar195;
                                  auVar26._16_4_ = fVar262 * fVar196;
                                  auVar26._20_4_ = fVar263 * fVar197;
                                  auVar26._24_4_ = fVar264 * fVar198;
                                  auVar26._28_4_ = auVar19._28_4_ + fVar154;
                                  auVar23 = vsubps_avx(auVar26,auVar25);
                                  fVar184 = *(float *)(local_1c70 + lVar66 * 4 + 0x50);
                                  local_1ce0._4_4_ = fVar184;
                                  local_1ce0._0_4_ = fVar184;
                                  local_1ce0._8_4_ = fVar184;
                                  local_1ce0._12_4_ = fVar184;
                                  local_1ce0._16_4_ = fVar184;
                                  local_1ce0._20_4_ = fVar184;
                                  local_1ce0._24_4_ = fVar184;
                                  local_1ce0._28_4_ = fVar184;
                                  fVar193 = *(float *)(local_1c70 + lVar66 * 4 + 0x60);
                                  local_1d00._4_4_ = fVar193;
                                  local_1d00._0_4_ = fVar193;
                                  local_1d00._8_4_ = fVar193;
                                  local_1d00._12_4_ = fVar193;
                                  local_1d00._16_4_ = fVar193;
                                  local_1d00._20_4_ = fVar193;
                                  local_1d00._24_4_ = fVar193;
                                  local_1d00._28_4_ = fVar193;
                                  fStack_1d50 = *(float *)(local_1c70 + lVar66 * 4 + 0x40);
                                  local_1d60._4_4_ = fStack_1d50;
                                  local_1d60._0_4_ = fStack_1d50;
                                  fStack_1d58 = fStack_1d50;
                                  fStack_1d54 = fStack_1d50;
                                  local_17a0._0_4_ =
                                       auVar21._0_4_ * fStack_1d50 +
                                       auVar23._0_4_ * fVar193 + fVar184 * auVar22._0_4_;
                                  local_17a0._4_4_ =
                                       auVar21._4_4_ * fStack_1d50 +
                                       auVar23._4_4_ * fVar193 + fVar184 * auVar22._4_4_;
                                  local_17a0._8_4_ =
                                       auVar21._8_4_ * fStack_1d50 +
                                       auVar23._8_4_ * fVar193 + fVar184 * auVar22._8_4_;
                                  local_17a0._12_4_ =
                                       auVar21._12_4_ * fStack_1d50 +
                                       auVar23._12_4_ * fVar193 + fVar184 * auVar22._12_4_;
                                  local_17a0._16_4_ =
                                       auVar21._16_4_ * fStack_1d50 +
                                       auVar23._16_4_ * fVar193 + fVar184 * auVar22._16_4_;
                                  local_17a0._20_4_ =
                                       auVar21._20_4_ * fStack_1d50 +
                                       auVar23._20_4_ * fVar193 + fVar184 * auVar22._20_4_;
                                  local_17a0._24_4_ =
                                       auVar21._24_4_ * fStack_1d50 +
                                       auVar23._24_4_ * fVar193 + fVar184 * auVar22._24_4_;
                                  local_17a0._28_4_ =
                                       auVar22._28_4_ + auVar23._28_4_ + auVar22._28_4_;
                                  auVar21 = vsubps_avx(local_1a60,auVar129);
                                  auVar22 = vsubps_avx(local_1720,auVar96);
                                  fVar194 = fVar131 + auVar129._0_4_;
                                  fVar195 = fVar134 + auVar129._4_4_;
                                  fVar196 = fVar147 + auVar129._8_4_;
                                  fVar197 = fVar150 + auVar129._12_4_;
                                  fVar198 = fVar10 + auVar129._16_4_;
                                  fVar199 = fVar13 + auVar129._20_4_;
                                  fVar208 = fVar16 + auVar129._24_4_;
                                  fVar210 = auVar96._0_4_ + fVar132;
                                  fVar212 = auVar96._4_4_ + fVar135;
                                  fVar214 = auVar96._8_4_ + fVar148;
                                  fVar216 = auVar96._12_4_ + fVar151;
                                  fVar218 = auVar96._16_4_ + fVar11;
                                  fVar231 = auVar96._20_4_ + fVar14;
                                  fVar235 = auVar96._24_4_ + fVar17;
                                  fVar284 = auVar22._0_4_;
                                  fVar287 = auVar22._4_4_;
                                  auVar27._4_4_ = fVar287 * fVar195;
                                  auVar27._0_4_ = fVar284 * fVar194;
                                  fVar288 = auVar22._8_4_;
                                  auVar27._8_4_ = fVar288 * fVar196;
                                  fVar289 = auVar22._12_4_;
                                  auVar27._12_4_ = fVar289 * fVar197;
                                  fVar290 = auVar22._16_4_;
                                  auVar27._16_4_ = fVar290 * fVar198;
                                  fVar291 = auVar22._20_4_;
                                  auVar27._20_4_ = fVar291 * fVar199;
                                  fVar292 = auVar22._24_4_;
                                  auVar27._24_4_ = fVar292 * fVar208;
                                  auVar27._28_4_ = local_1760._28_4_;
                                  fVar242 = auVar21._0_4_;
                                  fVar244 = auVar21._4_4_;
                                  auVar28._4_4_ = fVar244 * fVar212;
                                  auVar28._0_4_ = fVar242 * fVar210;
                                  fVar246 = auVar21._8_4_;
                                  auVar28._8_4_ = fVar246 * fVar214;
                                  fVar248 = auVar21._12_4_;
                                  auVar28._12_4_ = fVar248 * fVar216;
                                  fVar250 = auVar21._16_4_;
                                  auVar28._16_4_ = fVar250 * fVar218;
                                  fVar252 = auVar21._20_4_;
                                  auVar28._20_4_ = fVar252 * fVar231;
                                  fVar254 = auVar21._24_4_;
                                  auVar28._24_4_ = fVar254 * fVar235;
                                  auVar28._28_4_ = fVar154;
                                  auVar21 = vsubps_avx(auVar28,auVar27);
                                  auVar22 = vsubps_avx(local_1a40,auVar94);
                                  fVar269 = auVar22._0_4_;
                                  fVar273 = auVar22._4_4_;
                                  auVar29._4_4_ = fVar273 * fVar212;
                                  auVar29._0_4_ = fVar269 * fVar210;
                                  fVar275 = auVar22._8_4_;
                                  auVar29._8_4_ = fVar275 * fVar214;
                                  fVar277 = auVar22._12_4_;
                                  auVar29._12_4_ = fVar277 * fVar216;
                                  fVar279 = auVar22._16_4_;
                                  auVar29._16_4_ = fVar279 * fVar218;
                                  fVar281 = auVar22._20_4_;
                                  auVar29._20_4_ = fVar281 * fVar231;
                                  fVar283 = auVar22._24_4_;
                                  auVar29._24_4_ = fVar283 * fVar235;
                                  auVar29._28_4_ = auVar96._28_4_ + local_1720._28_4_;
                                  fVar210 = auVar94._0_4_ + fVar133;
                                  fVar212 = auVar94._4_4_ + fVar146;
                                  fVar214 = auVar94._8_4_ + fVar149;
                                  fVar216 = auVar94._12_4_ + fVar153;
                                  fVar218 = auVar94._16_4_ + fVar12;
                                  fVar231 = auVar94._20_4_ + fVar15;
                                  fVar235 = auVar94._24_4_ + fVar18;
                                  fVar265 = auVar94._28_4_;
                                  auVar30._4_4_ = fVar212 * fVar287;
                                  auVar30._0_4_ = fVar210 * fVar284;
                                  auVar30._8_4_ = fVar214 * fVar288;
                                  auVar30._12_4_ = fVar216 * fVar289;
                                  auVar30._16_4_ = fVar218 * fVar290;
                                  auVar30._20_4_ = fVar231 * fVar291;
                                  auVar30._24_4_ = fVar235 * fVar292;
                                  auVar30._28_4_ = fVar265;
                                  auVar23 = vsubps_avx(auVar30,auVar29);
                                  auVar31._4_4_ = fVar212 * fVar244;
                                  auVar31._0_4_ = fVar210 * fVar242;
                                  auVar31._8_4_ = fVar214 * fVar246;
                                  auVar31._12_4_ = fVar216 * fVar248;
                                  auVar31._16_4_ = fVar218 * fVar250;
                                  auVar31._20_4_ = fVar231 * fVar252;
                                  auVar31._24_4_ = fVar235 * fVar254;
                                  auVar31._28_4_ = fVar265 + local_1a40._28_4_;
                                  auVar32._4_4_ = fVar273 * fVar195;
                                  auVar32._0_4_ = fVar269 * fVar194;
                                  auVar32._8_4_ = fVar275 * fVar196;
                                  auVar32._12_4_ = fVar277 * fVar197;
                                  auVar32._16_4_ = fVar279 * fVar198;
                                  auVar32._20_4_ = fVar281 * fVar199;
                                  auVar32._24_4_ = fVar283 * fVar208;
                                  auVar32._28_4_ = fVar154 + auVar129._28_4_;
                                  auVar24 = vsubps_avx(auVar32,auVar31);
                                  fVar154 = auVar21._28_4_;
                                  local_17c0._0_4_ =
                                       fStack_1d50 * auVar21._0_4_ +
                                       auVar24._0_4_ * fVar193 + fVar184 * auVar23._0_4_;
                                  local_17c0._4_4_ =
                                       fStack_1d50 * auVar21._4_4_ +
                                       auVar24._4_4_ * fVar193 + fVar184 * auVar23._4_4_;
                                  local_17c0._8_4_ =
                                       fStack_1d50 * auVar21._8_4_ +
                                       auVar24._8_4_ * fVar193 + fVar184 * auVar23._8_4_;
                                  local_17c0._12_4_ =
                                       fStack_1d50 * auVar21._12_4_ +
                                       auVar24._12_4_ * fVar193 + fVar184 * auVar23._12_4_;
                                  local_17c0._16_4_ =
                                       fStack_1d50 * auVar21._16_4_ +
                                       auVar24._16_4_ * fVar193 + fVar184 * auVar23._16_4_;
                                  local_17c0._20_4_ =
                                       fStack_1d50 * auVar21._20_4_ +
                                       auVar24._20_4_ * fVar193 + fVar184 * auVar23._20_4_;
                                  local_17c0._24_4_ =
                                       fStack_1d50 * auVar21._24_4_ +
                                       auVar24._24_4_ * fVar193 + fVar184 * auVar23._24_4_;
                                  local_17c0._28_4_ = fVar154 + auVar24._28_4_ + auVar23._28_4_;
                                  auVar21 = vsubps_avx(auVar94,auVar95);
                                  fVar236 = auVar94._0_4_ + auVar95._0_4_;
                                  fVar237 = auVar94._4_4_ + auVar95._4_4_;
                                  fVar238 = auVar94._8_4_ + auVar95._8_4_;
                                  fVar239 = auVar94._12_4_ + auVar95._12_4_;
                                  fVar240 = auVar94._16_4_ + auVar95._16_4_;
                                  fVar171 = auVar94._20_4_ + auVar95._20_4_;
                                  fVar172 = auVar94._24_4_ + auVar95._24_4_;
                                  auVar94 = vsubps_avx(auVar129,auVar19);
                                  fVar210 = auVar19._0_4_ + auVar129._0_4_;
                                  fVar212 = auVar19._4_4_ + auVar129._4_4_;
                                  fVar214 = auVar19._8_4_ + auVar129._8_4_;
                                  fVar216 = auVar19._12_4_ + auVar129._12_4_;
                                  fVar218 = auVar19._16_4_ + auVar129._16_4_;
                                  fVar231 = auVar19._20_4_ + auVar129._20_4_;
                                  fVar235 = auVar19._24_4_ + auVar129._24_4_;
                                  auVar23 = vsubps_avx(auVar96,auVar20);
                                  fVar194 = auVar96._0_4_ + auVar20._0_4_;
                                  fVar195 = auVar96._4_4_ + auVar20._4_4_;
                                  fVar196 = auVar96._8_4_ + auVar20._8_4_;
                                  fVar197 = auVar96._12_4_ + auVar20._12_4_;
                                  fVar198 = auVar96._16_4_ + auVar20._16_4_;
                                  fVar199 = auVar96._20_4_ + auVar20._20_4_;
                                  fVar208 = auVar96._24_4_ + auVar20._24_4_;
                                  fVar220 = auVar23._0_4_;
                                  fVar225 = auVar23._4_4_;
                                  auVar20._4_4_ = fVar225 * fVar212;
                                  auVar20._0_4_ = fVar220 * fVar210;
                                  fVar226 = auVar23._8_4_;
                                  auVar20._8_4_ = fVar226 * fVar214;
                                  fVar227 = auVar23._12_4_;
                                  auVar20._12_4_ = fVar227 * fVar216;
                                  fVar228 = auVar23._16_4_;
                                  auVar20._16_4_ = fVar228 * fVar218;
                                  fVar229 = auVar23._20_4_;
                                  auVar20._20_4_ = fVar229 * fVar231;
                                  fVar230 = auVar23._24_4_;
                                  auVar20._24_4_ = fVar230 * fVar235;
                                  auVar20._28_4_ = fVar152;
                                  fVar243 = auVar94._0_4_;
                                  fVar245 = auVar94._4_4_;
                                  auVar33._4_4_ = fVar245 * fVar195;
                                  auVar33._0_4_ = fVar243 * fVar194;
                                  fVar247 = auVar94._8_4_;
                                  auVar33._8_4_ = fVar247 * fVar196;
                                  fVar249 = auVar94._12_4_;
                                  auVar33._12_4_ = fVar249 * fVar197;
                                  fVar251 = auVar94._16_4_;
                                  auVar33._16_4_ = fVar251 * fVar198;
                                  fVar253 = auVar94._20_4_;
                                  auVar33._20_4_ = fVar253 * fVar199;
                                  fVar255 = auVar94._24_4_;
                                  auVar33._24_4_ = fVar255 * fVar208;
                                  auVar33._28_4_ = fVar154;
                                  auVar94 = vsubps_avx(auVar33,auVar20);
                                  fVar200 = auVar21._0_4_;
                                  fVar209 = auVar21._4_4_;
                                  auVar34._4_4_ = fVar209 * fVar195;
                                  auVar34._0_4_ = fVar200 * fVar194;
                                  fVar211 = auVar21._8_4_;
                                  auVar34._8_4_ = fVar211 * fVar196;
                                  fVar213 = auVar21._12_4_;
                                  auVar34._12_4_ = fVar213 * fVar197;
                                  fVar215 = auVar21._16_4_;
                                  auVar34._16_4_ = fVar215 * fVar198;
                                  fVar217 = auVar21._20_4_;
                                  auVar34._20_4_ = fVar217 * fVar199;
                                  fVar219 = auVar21._24_4_;
                                  auVar34._24_4_ = fVar219 * fVar208;
                                  auVar34._28_4_ = auVar96._28_4_ + fVar152;
                                  auVar35._4_4_ = fVar225 * fVar237;
                                  auVar35._0_4_ = fVar220 * fVar236;
                                  auVar35._8_4_ = fVar226 * fVar238;
                                  auVar35._12_4_ = fVar227 * fVar239;
                                  auVar35._16_4_ = fVar228 * fVar240;
                                  auVar35._20_4_ = fVar229 * fVar171;
                                  auVar35._24_4_ = fVar230 * fVar172;
                                  auVar35._28_4_ = fVar154;
                                  auVar20 = vsubps_avx(auVar35,auVar34);
                                  auVar36._4_4_ = fVar245 * fVar237;
                                  auVar36._0_4_ = fVar243 * fVar236;
                                  auVar36._8_4_ = fVar247 * fVar238;
                                  auVar36._12_4_ = fVar249 * fVar239;
                                  auVar36._16_4_ = fVar251 * fVar240;
                                  auVar36._20_4_ = fVar253 * fVar171;
                                  auVar36._24_4_ = fVar255 * fVar172;
                                  auVar36._28_4_ = fVar265 + auVar95._28_4_;
                                  auVar37._4_4_ = fVar209 * fVar212;
                                  auVar37._0_4_ = fVar200 * fVar210;
                                  auVar37._8_4_ = fVar211 * fVar214;
                                  auVar37._12_4_ = fVar213 * fVar216;
                                  auVar37._16_4_ = fVar215 * fVar218;
                                  auVar37._20_4_ = fVar217 * fVar231;
                                  auVar37._24_4_ = fVar219 * fVar235;
                                  auVar37._28_4_ = auVar19._28_4_ + auVar129._28_4_;
                                  auVar129 = vsubps_avx(auVar37,auVar36);
                                  auVar110._0_4_ =
                                       fStack_1d50 * auVar94._0_4_ +
                                       auVar129._0_4_ * fVar193 + fVar184 * auVar20._0_4_;
                                  auVar110._4_4_ =
                                       fStack_1d50 * auVar94._4_4_ +
                                       auVar129._4_4_ * fVar193 + fVar184 * auVar20._4_4_;
                                  auVar110._8_4_ =
                                       fStack_1d50 * auVar94._8_4_ +
                                       auVar129._8_4_ * fVar193 + fVar184 * auVar20._8_4_;
                                  auVar110._12_4_ =
                                       fStack_1d50 * auVar94._12_4_ +
                                       auVar129._12_4_ * fVar193 + fVar184 * auVar20._12_4_;
                                  auVar110._16_4_ =
                                       fStack_1d50 * auVar94._16_4_ +
                                       auVar129._16_4_ * fVar193 + fVar184 * auVar20._16_4_;
                                  auVar110._20_4_ =
                                       fStack_1d50 * auVar94._20_4_ +
                                       auVar129._20_4_ * fVar193 + fVar184 * auVar20._20_4_;
                                  auVar110._24_4_ =
                                       fStack_1d50 * auVar94._24_4_ +
                                       auVar129._24_4_ * fVar193 + fVar184 * auVar20._24_4_;
                                  auVar110._28_4_ =
                                       auVar129._28_4_ + auVar129._28_4_ + auVar20._28_4_;
                                  local_1c40._0_4_ =
                                       auVar110._0_4_ + local_17a0._0_4_ + local_17c0._0_4_;
                                  local_1c40._4_4_ =
                                       auVar110._4_4_ + local_17a0._4_4_ + local_17c0._4_4_;
                                  local_1c40._8_4_ =
                                       auVar110._8_4_ + local_17a0._8_4_ + local_17c0._8_4_;
                                  local_1c40._12_4_ =
                                       auVar110._12_4_ + local_17a0._12_4_ + local_17c0._12_4_;
                                  local_1c40._16_4_ =
                                       auVar110._16_4_ + local_17a0._16_4_ + local_17c0._16_4_;
                                  local_1c40._20_4_ =
                                       auVar110._20_4_ + local_17a0._20_4_ + local_17c0._20_4_;
                                  local_1c40._24_4_ =
                                       auVar110._24_4_ + local_17a0._24_4_ + local_17c0._24_4_;
                                  local_1c40._28_4_ =
                                       auVar110._28_4_ + local_17a0._28_4_ + local_17c0._28_4_;
                                  auVar94 = vminps_avx(local_17a0,local_17c0);
                                  auVar94 = vminps_avx(auVar94,auVar110);
                                  auVar167._8_4_ = 0x7fffffff;
                                  auVar167._0_8_ = 0x7fffffff7fffffff;
                                  auVar167._12_4_ = 0x7fffffff;
                                  auVar167._16_4_ = 0x7fffffff;
                                  auVar167._20_4_ = 0x7fffffff;
                                  auVar167._24_4_ = 0x7fffffff;
                                  auVar167._28_4_ = 0x7fffffff;
                                  local_1820 = vandps_avx(local_1c40._0_32_,auVar167);
                                  fVar154 = local_1820._0_4_ * 1.1920929e-07;
                                  fVar194 = local_1820._4_4_ * 1.1920929e-07;
                                  auVar19._4_4_ = fVar194;
                                  auVar19._0_4_ = fVar154;
                                  fVar195 = local_1820._8_4_ * 1.1920929e-07;
                                  auVar19._8_4_ = fVar195;
                                  fVar196 = local_1820._12_4_ * 1.1920929e-07;
                                  auVar19._12_4_ = fVar196;
                                  fVar197 = local_1820._16_4_ * 1.1920929e-07;
                                  auVar19._16_4_ = fVar197;
                                  fVar198 = local_1820._20_4_ * 1.1920929e-07;
                                  auVar19._20_4_ = fVar198;
                                  uVar62 = local_1820._28_4_;
                                  fVar199 = local_1820._24_4_ * 1.1920929e-07;
                                  auVar19._24_4_ = fVar199;
                                  auVar19._28_4_ = uVar62;
                                  auVar183._0_8_ = CONCAT44(fVar194,fVar154) ^ 0x8000000080000000;
                                  auVar183._8_4_ = -fVar195;
                                  auVar183._12_4_ = -fVar196;
                                  auVar183._16_4_ = -fVar197;
                                  auVar183._20_4_ = -fVar198;
                                  auVar183._24_4_ = -fVar199;
                                  auVar183._28_4_ = uVar62 ^ 0x80000000;
                                  auVar94 = vcmpps_avx(auVar94,auVar183,5);
                                  auVar95 = vmaxps_avx(local_17a0,local_17c0);
                                  auVar129 = vmaxps_avx(auVar95,auVar110);
                                  auVar129 = vcmpps_avx(auVar129,auVar19,2);
                                  auVar94 = vorps_avx(auVar94,auVar129);
                                  NVar71.ptr = local_1db0.ptr;
                                  puVar72 = local_1db8;
                                  pauVar73 = local_1dc0;
                                  local_1da0 = uVar74;
                                  local_1d80 = lVar66;
                                  fStack_1d4c = fStack_1d50;
                                  fStack_1d48 = fStack_1d50;
                                  fStack_1d44 = fStack_1d50;
                                  local_1780 = auVar130;
                                  if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar94 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar94 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar94 >> 0x7f,0) != '\0') ||
                                        (auVar94 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar94 >> 0xbf,0) != '\0')
                                      || (auVar94 & (undefined1  [32])0x100000000) !=
                                         (undefined1  [32])0x0) || auVar94[0x1f] < '\0') {
                                    auVar38._4_4_ = fVar244 * fVar113;
                                    auVar38._0_4_ = fVar242 * fVar112;
                                    auVar38._8_4_ = fVar246 * fVar114;
                                    auVar38._12_4_ = fVar248 * fVar115;
                                    auVar38._16_4_ = fVar250 * fVar116;
                                    auVar38._20_4_ = fVar252 * fVar117;
                                    auVar38._24_4_ = fVar254 * fVar118;
                                    auVar38._28_4_ = auVar129._28_4_;
                                    auVar39._4_4_ = fVar272 * fVar287;
                                    auVar39._0_4_ = fVar268 * fVar284;
                                    auVar39._8_4_ = fVar274 * fVar288;
                                    auVar39._12_4_ = fVar276 * fVar289;
                                    auVar39._16_4_ = fVar278 * fVar290;
                                    auVar39._20_4_ = fVar280 * fVar291;
                                    auVar39._24_4_ = fVar282 * fVar292;
                                    auVar39._28_4_ = uVar62;
                                    auVar96 = vsubps_avx(auVar39,auVar38);
                                    auVar40._4_4_ = fVar287 * fVar245;
                                    auVar40._0_4_ = fVar284 * fVar243;
                                    auVar40._8_4_ = fVar288 * fVar247;
                                    auVar40._12_4_ = fVar289 * fVar249;
                                    auVar40._16_4_ = fVar290 * fVar251;
                                    auVar40._20_4_ = fVar291 * fVar253;
                                    auVar40._24_4_ = fVar292 * fVar255;
                                    auVar40._28_4_ = auVar95._28_4_;
                                    auVar41._4_4_ = fVar244 * fVar225;
                                    auVar41._0_4_ = fVar242 * fVar220;
                                    auVar41._8_4_ = fVar246 * fVar226;
                                    auVar41._12_4_ = fVar248 * fVar227;
                                    auVar41._16_4_ = fVar250 * fVar228;
                                    auVar41._20_4_ = fVar252 * fVar229;
                                    auVar41._24_4_ = fVar254 * fVar230;
                                    auVar41._28_4_ = local_1c40._28_4_;
                                    auVar20 = vsubps_avx(auVar41,auVar40);
                                    auVar97._8_4_ = 0x7fffffff;
                                    auVar97._0_8_ = 0x7fffffff7fffffff;
                                    auVar97._12_4_ = 0x7fffffff;
                                    auVar97._16_4_ = 0x7fffffff;
                                    auVar97._20_4_ = 0x7fffffff;
                                    auVar97._24_4_ = 0x7fffffff;
                                    auVar97._28_4_ = 0x7fffffff;
                                    auVar129 = vandps_avx(auVar38,auVar97);
                                    auVar95 = vandps_avx(auVar40,auVar97);
                                    auVar129 = vcmpps_avx(auVar129,auVar95,1);
                                    auVar19 = vblendvps_avx(auVar20,auVar96,auVar129);
                                    auVar42._4_4_ = fVar273 * fVar225;
                                    auVar42._0_4_ = fVar269 * fVar220;
                                    auVar42._8_4_ = fVar275 * fVar226;
                                    auVar42._12_4_ = fVar277 * fVar227;
                                    auVar42._16_4_ = fVar279 * fVar228;
                                    auVar42._20_4_ = fVar281 * fVar229;
                                    auVar42._24_4_ = fVar283 * fVar230;
                                    auVar42._28_4_ = auVar96._28_4_;
                                    auVar43._4_4_ = fVar273 * fVar113;
                                    auVar43._0_4_ = fVar269 * fVar112;
                                    auVar43._8_4_ = fVar275 * fVar114;
                                    auVar43._12_4_ = fVar277 * fVar115;
                                    auVar43._16_4_ = fVar279 * fVar116;
                                    auVar43._20_4_ = fVar281 * fVar117;
                                    auVar43._24_4_ = fVar283 * fVar118;
                                    auVar43._28_4_ = auVar95._28_4_;
                                    auVar44._4_4_ = fVar259 * fVar287;
                                    auVar44._0_4_ = fVar256 * fVar284;
                                    auVar44._8_4_ = fVar260 * fVar288;
                                    auVar44._12_4_ = fVar261 * fVar289;
                                    auVar44._16_4_ = fVar262 * fVar290;
                                    auVar44._20_4_ = fVar263 * fVar291;
                                    auVar44._24_4_ = fVar264 * fVar292;
                                    auVar44._28_4_ = auVar23._28_4_;
                                    auVar96 = vsubps_avx(auVar43,auVar44);
                                    auVar45._4_4_ = fVar287 * fVar209;
                                    auVar45._0_4_ = fVar284 * fVar200;
                                    auVar45._8_4_ = fVar288 * fVar211;
                                    auVar45._12_4_ = fVar289 * fVar213;
                                    auVar45._16_4_ = fVar290 * fVar215;
                                    auVar45._20_4_ = fVar291 * fVar217;
                                    auVar45._24_4_ = fVar292 * fVar219;
                                    auVar45._28_4_ = auVar20._28_4_;
                                    auVar20 = vsubps_avx(auVar45,auVar42);
                                    auVar129 = vandps_avx(auVar44,auVar97);
                                    auVar95 = vandps_avx(auVar42,auVar97);
                                    auVar95 = vcmpps_avx(auVar129,auVar95,1);
                                    auVar20 = vblendvps_avx(auVar20,auVar96,auVar95);
                                    auVar46._4_4_ = fVar244 * fVar209;
                                    auVar46._0_4_ = fVar242 * fVar200;
                                    auVar46._8_4_ = fVar246 * fVar211;
                                    auVar46._12_4_ = fVar248 * fVar213;
                                    auVar46._16_4_ = fVar250 * fVar215;
                                    auVar46._20_4_ = fVar252 * fVar217;
                                    auVar46._24_4_ = fVar254 * fVar219;
                                    auVar46._28_4_ = auVar95._28_4_;
                                    auVar47._4_4_ = fVar259 * fVar244;
                                    auVar47._0_4_ = fVar256 * fVar242;
                                    auVar47._8_4_ = fVar260 * fVar246;
                                    auVar47._12_4_ = fVar261 * fVar248;
                                    auVar47._16_4_ = fVar262 * fVar250;
                                    auVar47._20_4_ = fVar263 * fVar252;
                                    auVar47._24_4_ = fVar264 * fVar254;
                                    auVar47._28_4_ = auVar96._28_4_;
                                    auVar48._4_4_ = fVar273 * fVar272;
                                    auVar48._0_4_ = fVar269 * fVar268;
                                    auVar48._8_4_ = fVar275 * fVar274;
                                    auVar48._12_4_ = fVar277 * fVar276;
                                    auVar48._16_4_ = fVar279 * fVar278;
                                    auVar48._20_4_ = fVar281 * fVar280;
                                    auVar48._24_4_ = fVar283 * fVar282;
                                    auVar48._28_4_ = auVar21._28_4_;
                                    auVar49._4_4_ = fVar273 * fVar245;
                                    auVar49._0_4_ = fVar269 * fVar243;
                                    auVar49._8_4_ = fVar275 * fVar247;
                                    auVar49._12_4_ = fVar277 * fVar249;
                                    auVar49._16_4_ = fVar279 * fVar251;
                                    auVar49._20_4_ = fVar281 * fVar253;
                                    auVar49._24_4_ = fVar283 * fVar255;
                                    auVar49._28_4_ = local_1780._28_4_;
                                    auVar21 = vsubps_avx(auVar47,auVar48);
                                    auVar23 = vsubps_avx(auVar49,auVar46);
                                    auVar95 = vandps_avx(auVar48,auVar97);
                                    auVar96 = vandps_avx(auVar46,auVar97);
                                    auVar96 = vcmpps_avx(auVar95,auVar96,1);
                                    auVar96 = vblendvps_avx(auVar23,auVar21,auVar96);
                                    auVar91 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
                                    fVar118 = auVar96._0_4_;
                                    fVar194 = auVar96._4_4_;
                                    fVar195 = auVar96._8_4_;
                                    fVar196 = auVar96._12_4_;
                                    fVar197 = auVar96._16_4_;
                                    fVar198 = auVar96._20_4_;
                                    fVar199 = auVar96._24_4_;
                                    fVar231 = auVar20._0_4_;
                                    fVar235 = auVar20._4_4_;
                                    fVar152 = auVar20._8_4_;
                                    fVar236 = auVar20._12_4_;
                                    fVar237 = auVar20._16_4_;
                                    fVar238 = auVar20._20_4_;
                                    fVar239 = auVar20._24_4_;
                                    fVar154 = auVar19._0_4_;
                                    fVar112 = auVar19._4_4_;
                                    fVar113 = auVar19._8_4_;
                                    fVar114 = auVar19._12_4_;
                                    fVar115 = auVar19._16_4_;
                                    fVar116 = auVar19._20_4_;
                                    fVar117 = auVar19._24_4_;
                                    fVar208 = fVar154 * fStack_1d50 +
                                              fVar118 * fVar193 + fVar231 * fVar184;
                                    fVar210 = fVar112 * fStack_1d50 +
                                              fVar194 * fVar193 + fVar235 * fVar184;
                                    fVar212 = fVar113 * fStack_1d50 +
                                              fVar195 * fVar193 + fVar152 * fVar184;
                                    fVar214 = fVar114 * fStack_1d50 +
                                              fVar196 * fVar193 + fVar236 * fVar184;
                                    fVar216 = fVar115 * fStack_1d50 +
                                              fVar197 * fVar193 + fVar237 * fVar184;
                                    fVar218 = fVar116 * fStack_1d50 +
                                              fVar198 * fVar193 + fVar238 * fVar184;
                                    fVar184 = fVar117 * fStack_1d50 +
                                              fVar199 * fVar193 + fVar239 * fVar184;
                                    fVar193 = auVar94._28_4_ + 0.0 + 0.0;
                                    auVar168._0_4_ = fVar208 + fVar208;
                                    auVar168._4_4_ = fVar210 + fVar210;
                                    auVar168._8_4_ = fVar212 + fVar212;
                                    auVar168._12_4_ = fVar214 + fVar214;
                                    auVar168._16_4_ = fVar216 + fVar216;
                                    auVar168._20_4_ = fVar218 + fVar218;
                                    auVar168._24_4_ = fVar184 + fVar184;
                                    auVar168._28_4_ = fVar193 + fVar193;
                                    fVar208 = fVar154 * fVar133 +
                                              fVar118 * fVar132 + fVar231 * fVar131;
                                    fVar146 = fVar112 * fVar146 +
                                              fVar194 * fVar135 + fVar235 * fVar134;
                                    fVar147 = fVar113 * fVar149 +
                                              fVar195 * fVar148 + fVar152 * fVar147;
                                    fVar148 = fVar114 * fVar153 +
                                              fVar196 * fVar151 + fVar236 * fVar150;
                                    fVar149 = fVar115 * fVar12 + fVar197 * fVar11 + fVar237 * fVar10
                                    ;
                                    fVar150 = fVar116 * fVar15 + fVar198 * fVar14 + fVar238 * fVar13
                                    ;
                                    fVar151 = fVar117 * fVar18 + fVar199 * fVar17 + fVar239 * fVar16
                                    ;
                                    fVar153 = auVar95._28_4_ + fVar193 + auVar95._28_4_;
                                    auVar94 = vrcpps_avx(auVar168);
                                    fVar184 = auVar94._0_4_;
                                    fVar193 = auVar94._4_4_;
                                    auVar50._4_4_ = auVar168._4_4_ * fVar193;
                                    auVar50._0_4_ = auVar168._0_4_ * fVar184;
                                    fVar131 = auVar94._8_4_;
                                    auVar50._8_4_ = auVar168._8_4_ * fVar131;
                                    fVar132 = auVar94._12_4_;
                                    auVar50._12_4_ = auVar168._12_4_ * fVar132;
                                    fVar133 = auVar94._16_4_;
                                    auVar50._16_4_ = auVar168._16_4_ * fVar133;
                                    fVar134 = auVar94._20_4_;
                                    auVar50._20_4_ = auVar168._20_4_ * fVar134;
                                    fVar135 = auVar94._24_4_;
                                    auVar50._24_4_ = auVar168._24_4_ * fVar135;
                                    auVar50._28_4_ = auVar129._28_4_;
                                    auVar98._8_4_ = 0x3f800000;
                                    auVar98._0_8_ = &DAT_3f8000003f800000;
                                    auVar98._12_4_ = 0x3f800000;
                                    auVar98._16_4_ = 0x3f800000;
                                    auVar98._20_4_ = 0x3f800000;
                                    auVar98._24_4_ = 0x3f800000;
                                    auVar98._28_4_ = 0x3f800000;
                                    auVar94 = vsubps_avx(auVar98,auVar50);
                                    auVar51._4_4_ =
                                         (fVar146 + fVar146) * (auVar94._4_4_ * fVar193 + fVar193);
                                    auVar51._0_4_ =
                                         (fVar208 + fVar208) * (auVar94._0_4_ * fVar184 + fVar184);
                                    auVar51._8_4_ =
                                         (fVar147 + fVar147) * (auVar94._8_4_ * fVar131 + fVar131);
                                    auVar51._12_4_ =
                                         (fVar148 + fVar148) * (auVar94._12_4_ * fVar132 + fVar132);
                                    auVar51._16_4_ =
                                         (fVar149 + fVar149) * (auVar94._16_4_ * fVar133 + fVar133);
                                    auVar51._20_4_ =
                                         (fVar150 + fVar150) * (auVar94._20_4_ * fVar134 + fVar134);
                                    auVar51._24_4_ =
                                         (fVar151 + fVar151) * (auVar94._24_4_ * fVar135 + fVar135);
                                    auVar51._28_4_ = fVar153 + fVar153;
                                    uVar69 = *(undefined4 *)(local_1c70 + lVar66 * 4 + 0x30);
                                    auVar206._4_4_ = uVar69;
                                    auVar206._0_4_ = uVar69;
                                    auVar206._8_4_ = uVar69;
                                    auVar206._12_4_ = uVar69;
                                    auVar206._16_4_ = uVar69;
                                    auVar206._20_4_ = uVar69;
                                    auVar206._24_4_ = uVar69;
                                    auVar206._28_4_ = uVar69;
                                    auVar94 = vcmpps_avx(auVar206,auVar51,2);
                                    uVar69 = *(undefined4 *)(local_1c70 + lVar66 * 4 + 0x80);
                                    auVar224._4_4_ = uVar69;
                                    auVar224._0_4_ = uVar69;
                                    auVar224._8_4_ = uVar69;
                                    auVar224._12_4_ = uVar69;
                                    auVar224._16_4_ = uVar69;
                                    auVar224._20_4_ = uVar69;
                                    auVar224._24_4_ = uVar69;
                                    auVar224._28_4_ = uVar69;
                                    auVar129 = vcmpps_avx(auVar51,auVar224,2);
                                    auVar94 = vandps_avx(auVar129,auVar94);
                                    auVar102 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
                                    auVar91 = vpand_avx(auVar102,auVar91);
                                    auVar102 = vpmovsxwd_avx(auVar91);
                                    auVar155 = vpshufd_avx(auVar91,0xee);
                                    auVar155 = vpmovsxwd_avx(auVar155);
                                    auVar207._16_16_ = auVar155;
                                    auVar207._0_16_ = auVar102;
                                    auVar96 = local_1c40._0_32_;
                                    if ((((((((auVar207 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar207 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar207 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar207 >> 0x7f,0) != '\0') ||
                                          (auVar207 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) ||
                                         SUB161(auVar155 >> 0x3f,0) != '\0') ||
                                        (auVar207 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar155[0xf] < '\0') {
                                      auVar94 = vcmpps_avx(auVar168,_DAT_02020f00,4);
                                      auVar102 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
                                      auVar91 = vpand_avx(auVar91,auVar102);
                                      auVar102 = vpmovsxwd_avx(auVar91);
                                      auVar91 = vpunpckhwd_avx(auVar91,auVar91);
                                      auVar169._16_16_ = auVar91;
                                      auVar169._0_16_ = auVar102;
                                      if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar169 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar169 >> 0x5f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             SUB321(auVar169 >> 0x7f,0) != '\0') ||
                                            (auVar169 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                           SUB161(auVar91 >> 0x3f,0) != '\0') ||
                                          (auVar169 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar91[0xf] < '\0') {
                                        local_1980 = local_1c40._0_32_;
                                        local_1960 = &local_1dc1;
                                        local_1940 = auVar169;
                                        local_18e0 = auVar51;
                                        auVar94 = vsubps_avx(local_1c40._0_32_,local_17c0);
                                        auVar94 = vblendvps_avx(local_17a0,auVar94,local_1840);
                                        auVar129 = vsubps_avx(local_1c40._0_32_,local_17a0);
                                        auVar129 = vblendvps_avx(local_17c0,auVar129,local_1840);
                                        uStack_18a4 = auVar19._28_4_;
                                        local_18c0[0] = (float)local_1860._0_4_ * fVar154;
                                        local_18c0[1] = (float)local_1860._4_4_ * fVar112;
                                        local_18c0[2] = fStack_1858 * fVar113;
                                        local_18c0[3] = fStack_1854 * fVar114;
                                        fStack_18b0 = fStack_1850 * fVar115;
                                        fStack_18ac = fStack_184c * fVar116;
                                        fStack_18a8 = fStack_1848 * fVar117;
                                        local_18a0[0] = fVar231 * (float)local_1860._0_4_;
                                        local_18a0[1] = fVar235 * (float)local_1860._4_4_;
                                        local_18a0[2] = fVar152 * fStack_1858;
                                        local_18a0[3] = fVar236 * fStack_1854;
                                        fStack_1890 = fVar237 * fStack_1850;
                                        fStack_188c = fVar238 * fStack_184c;
                                        fStack_1888 = fVar239 * fStack_1848;
                                        uStack_1884 = uStack_18a4;
                                        local_1880[0] = (float)local_1860._0_4_ * fVar118;
                                        local_1880[1] = (float)local_1860._4_4_ * fVar194;
                                        local_1880[2] = fStack_1858 * fVar195;
                                        local_1880[3] = fStack_1854 * fVar196;
                                        fStack_1870 = fStack_1850 * fVar197;
                                        fStack_186c = fStack_184c * fVar198;
                                        fStack_1868 = fStack_1848 * fVar199;
                                        uStack_1864 = uStack_18a4;
                                        auVar107._0_4_ =
                                             (float)(int)(*(ushort *)(local_1c50 + 8 + local_1c58) -
                                                         1);
                                        auVar107._4_12_ = auVar22._4_12_;
                                        auVar91 = vrcpss_avx(auVar107,auVar107);
                                        auVar126._0_4_ =
                                             (float)(int)(*(ushort *)(local_1c50 + 10 + local_1c58)
                                                         - 1);
                                        auVar126._4_12_ = auVar22._4_12_;
                                        auVar102 = vrcpss_avx(auVar126,auVar126);
                                        auVar91 = ZEXT416((uint)(auVar91._0_4_ *
                                                                (2.0 - auVar91._0_4_ *
                                                                       auVar107._0_4_)));
                                        auVar91 = vshufps_avx(auVar91,auVar91,0);
                                        local_19c0[0] =
                                             (local_1c40._0_4_ * (float)local_17e0._0_4_ +
                                             auVar94._0_4_) * auVar91._0_4_;
                                        local_19c0[1] =
                                             (local_1c40._4_4_ * (float)local_17e0._4_4_ +
                                             auVar94._4_4_) * auVar91._4_4_;
                                        local_19c0[2] =
                                             (local_1c40._8_4_ * fStack_17d8 + auVar94._8_4_) *
                                             auVar91._8_4_;
                                        fStack_19a4 = auVar91._12_4_;
                                        local_19c0[3] =
                                             (local_1c40._12_4_ * fStack_17d4 + auVar94._12_4_) *
                                             fStack_19a4;
                                        fStack_19b0 = (local_1c40._16_4_ * fStack_17d0 +
                                                      auVar94._16_4_) * auVar91._0_4_;
                                        fStack_19ac = (local_1c40._20_4_ * fStack_17cc +
                                                      auVar94._20_4_) * auVar91._4_4_;
                                        fStack_19a8 = (local_1c40._24_4_ * fStack_17c8 +
                                                      auVar94._24_4_) * auVar91._8_4_;
                                        auVar91 = ZEXT416((uint)(auVar102._0_4_ *
                                                                (2.0 - auVar102._0_4_ *
                                                                       auVar126._0_4_)));
                                        auVar91 = vshufps_avx(auVar91,auVar91,0);
                                        fVar184 = (local_1c40._0_4_ * (float)local_1800._0_4_ +
                                                  auVar129._0_4_) * auVar91._0_4_;
                                        fVar193 = (local_1c40._4_4_ * (float)local_1800._4_4_ +
                                                  auVar129._4_4_) * auVar91._4_4_;
                                        local_19a0._4_4_ = fVar193;
                                        local_19a0._0_4_ = fVar184;
                                        fVar131 = (local_1c40._8_4_ * fStack_17f8 + auVar129._8_4_)
                                                  * auVar91._8_4_;
                                        local_19a0._8_4_ = fVar131;
                                        fVar132 = (local_1c40._12_4_ * fStack_17f4 + auVar129._12_4_
                                                  ) * auVar91._12_4_;
                                        local_19a0._12_4_ = fVar132;
                                        fVar133 = (local_1c40._16_4_ * fStack_17f0 + auVar129._16_4_
                                                  ) * auVar91._0_4_;
                                        local_19a0._16_4_ = fVar133;
                                        fVar134 = (local_1c40._20_4_ * fStack_17ec + auVar129._20_4_
                                                  ) * auVar91._4_4_;
                                        local_19a0._20_4_ = fVar134;
                                        fVar135 = (local_1c40._24_4_ * fStack_17e8 + auVar129._24_4_
                                                  ) * auVar91._8_4_;
                                        local_19a0._24_4_ = fVar135;
                                        local_19a0._28_4_ = auVar91._12_4_;
                                        pGVar75 = (local_1c48->geometries).items[local_1c60].ptr;
                                        if ((pGVar75->mask &
                                            *(uint *)(local_1c70 + lVar66 * 4 + 0x90)) != 0) {
                                          if ((local_1d20->args->filter != (RTCFilterFunctionN)0x0)
                                             || (pGVar75->occlusionFilterN !=
                                                 (RTCFilterFunctionN)0x0)) {
                                            auVar94 = vrcpps_avx(local_1c40._0_32_);
                                            fVar146 = auVar94._0_4_;
                                            auVar99._0_4_ = local_1c40._0_4_ * fVar146;
                                            fVar147 = auVar94._4_4_;
                                            auVar99._4_4_ = local_1c40._4_4_ * fVar147;
                                            fVar148 = auVar94._8_4_;
                                            auVar99._8_4_ = local_1c40._8_4_ * fVar148;
                                            fVar149 = auVar94._12_4_;
                                            auVar99._12_4_ = local_1c40._12_4_ * fVar149;
                                            fVar150 = auVar94._16_4_;
                                            auVar99._16_4_ = local_1c40._16_4_ * fVar150;
                                            fVar151 = auVar94._20_4_;
                                            auVar99._20_4_ = local_1c40._20_4_ * fVar151;
                                            fVar153 = auVar94._24_4_;
                                            auVar99._24_4_ = local_1c40._24_4_ * fVar153;
                                            auVar99._28_4_ = 0;
                                            auVar170._8_4_ = 0x3f800000;
                                            auVar170._0_8_ = &DAT_3f8000003f800000;
                                            auVar170._12_4_ = 0x3f800000;
                                            auVar170._16_4_ = 0x3f800000;
                                            auVar170._20_4_ = 0x3f800000;
                                            auVar170._24_4_ = 0x3f800000;
                                            auVar170._28_4_ = 0x3f800000;
                                            auVar129 = vsubps_avx(auVar170,auVar99);
                                            auVar100._0_4_ = fVar146 + fVar146 * auVar129._0_4_;
                                            auVar100._4_4_ = fVar147 + fVar147 * auVar129._4_4_;
                                            auVar100._8_4_ = fVar148 + fVar148 * auVar129._8_4_;
                                            auVar100._12_4_ = fVar149 + fVar149 * auVar129._12_4_;
                                            auVar100._16_4_ = fVar150 + fVar150 * auVar129._16_4_;
                                            auVar100._20_4_ = fVar151 + fVar151 * auVar129._20_4_;
                                            auVar100._24_4_ = fVar153 + fVar153 * auVar129._24_4_;
                                            auVar100._28_4_ = auVar94._28_4_ + auVar129._28_4_;
                                            auVar145._8_4_ = 0x219392ef;
                                            auVar145._0_8_ = 0x219392ef219392ef;
                                            auVar145._12_4_ = 0x219392ef;
                                            auVar145._16_4_ = 0x219392ef;
                                            auVar145._20_4_ = 0x219392ef;
                                            auVar145._24_4_ = 0x219392ef;
                                            auVar145._28_4_ = 0x219392ef;
                                            auVar94 = vcmpps_avx(local_1820,auVar145,5);
                                            auVar94 = vandps_avx(auVar94,auVar100);
                                            auVar52._4_4_ = local_19c0[1] * auVar94._4_4_;
                                            auVar52._0_4_ = local_19c0[0] * auVar94._0_4_;
                                            auVar52._8_4_ = local_19c0[2] * auVar94._8_4_;
                                            auVar52._12_4_ = local_19c0[3] * auVar94._12_4_;
                                            auVar52._16_4_ = fStack_19b0 * auVar94._16_4_;
                                            auVar52._20_4_ = fStack_19ac * auVar94._20_4_;
                                            auVar52._24_4_ = fStack_19a8 * auVar94._24_4_;
                                            auVar52._28_4_ = fStack_19a4;
                                            local_1920 = vminps_avx(auVar52,auVar170);
                                            auVar53._4_4_ = fVar193 * auVar94._4_4_;
                                            auVar53._0_4_ = fVar184 * auVar94._0_4_;
                                            auVar53._8_4_ = fVar131 * auVar94._8_4_;
                                            auVar53._12_4_ = fVar132 * auVar94._12_4_;
                                            auVar53._16_4_ = fVar133 * auVar94._16_4_;
                                            auVar53._20_4_ = fVar134 * auVar94._20_4_;
                                            auVar53._24_4_ = fVar135 * auVar94._24_4_;
                                            auVar53._28_4_ = auVar94._28_4_;
                                            local_1900 = vminps_avx(auVar53,auVar170);
                                            iVar63 = vmovmskps_avx(auVar169);
                                            uVar78 = CONCAT44((int)((ulong)lVar77 >> 0x20),iVar63);
                                            uVar65 = 0;
                                            if (uVar78 != 0) {
                                              for (; (uVar78 >> uVar65 & 1) == 0;
                                                  uVar65 = uVar65 + 1) {
                                              }
                                            }
                                            local_1c40[0] = iVar63 != 0;
                                            if (iVar63 != 0) {
                                              local_1a40._0_16_ =
                                                   *(undefined1 (*) [16])
                                                    (mm_lookupmask_ps +
                                                    (long)(1 << ((byte)lVar66 & 0x1f)) * 0x10);
                                              local_1a60._0_8_ = pGVar75;
                                              do {
                                                uVar173 = *(undefined4 *)(ray + lVar66 * 4 + 0x80);
                                                local_1ac0 = *(undefined4 *)
                                                              (local_1920 + uVar65 * 4);
                                                uVar69 = *(undefined4 *)(local_1900 + uVar65 * 4);
                                                local_1ab0._4_4_ = uVar69;
                                                local_1ab0._0_4_ = uVar69;
                                                local_1ab0._8_4_ = uVar69;
                                                local_1ab0._12_4_ = uVar69;
                                                *(undefined4 *)(ray + lVar66 * 4 + 0x80) =
                                                     *(undefined4 *)(local_18e0 + uVar65 * 4);
                                                local_1c00.context = context->user;
                                                local_1af0[0] = local_18c0[uVar65];
                                                fVar184 = local_18a0[uVar65];
                                                local_1ae0._4_4_ = fVar184;
                                                local_1ae0._0_4_ = fVar184;
                                                local_1ae0._8_4_ = fVar184;
                                                local_1ae0._12_4_ = fVar184;
                                                fVar184 = local_1880[uVar65];
                                                local_1ad0._4_4_ = fVar184;
                                                local_1ad0._0_4_ = fVar184;
                                                local_1ad0._8_4_ = fVar184;
                                                local_1ad0._12_4_ = fVar184;
                                                local_1af0[1] = local_1af0[0];
                                                local_1af0[2] = local_1af0[0];
                                                local_1af0[3] = local_1af0[0];
                                                uStack_1abc = local_1ac0;
                                                uStack_1ab8 = local_1ac0;
                                                uStack_1ab4 = local_1ac0;
                                                local_1aa0 = local_1a10._0_8_;
                                                uStack_1a98 = local_1a10._8_8_;
                                                local_1a90 = local_1a00;
                                                vcmpps_avx(ZEXT1632(local_1a00),ZEXT1632(local_1a00)
                                                           ,0xf);
                                                uStack_1a7c = (local_1c00.context)->instID[0];
                                                local_1a80 = uStack_1a7c;
                                                uStack_1a78 = uStack_1a7c;
                                                uStack_1a74 = uStack_1a7c;
                                                uStack_1a70 = (local_1c00.context)->instPrimID[0];
                                                uStack_1a6c = uStack_1a70;
                                                uStack_1a68 = uStack_1a70;
                                                uStack_1a64 = uStack_1a70;
                                                local_1cb0 = local_1a40._0_8_;
                                                uStack_1ca8 = local_1a40._8_8_;
                                                local_1c00.valid = (int *)&local_1cb0;
                                                local_1c00.geometryUserPtr = pGVar75->userPtr;
                                                local_1c00.ray = (RTCRayN *)ray;
                                                local_1c00.hit = (RTCHitN *)local_1af0;
                                                local_1c00.N = 4;
                                                local_1ce0._0_8_ = uVar78;
                                                local_1d00._0_4_ = uVar173;
                                                local_1d60 = (undefined1  [8])uVar65;
                                                if (pGVar75->occlusionFilterN !=
                                                    (RTCFilterFunctionN)0x0) {
                                                  (*pGVar75->occlusionFilterN)(&local_1c00);
                                                  NVar71.ptr = local_1db0.ptr;
                                                  lVar66 = local_1d80;
                                                  puVar72 = local_1db8;
                                                  pauVar73 = local_1dc0;
                                                  uVar74 = local_1da0;
                                                  pGVar75 = (Geometry *)local_1a60._0_8_;
                                                  uVar78 = local_1ce0._0_8_;
                                                  uVar173 = local_1d00._0_4_;
                                                }
                                                auVar54._8_8_ = uStack_1ca8;
                                                auVar54._0_8_ = local_1cb0;
                                                if (auVar54 == (undefined1  [16])0x0) {
                                                  auVar91 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                         _DAT_01feba10);
                                                  auVar91 = auVar91 ^ _DAT_01febe20;
                                                }
                                                else {
                                                  p_Var9 = context->args->filter;
                                                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                                     (((context->args->flags &
                                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                      (((pGVar75->field_8).field_0x2 & 0x40) != 0)))
                                                     ) {
                                                    (*p_Var9)(&local_1c00);
                                                    NVar71.ptr = local_1db0.ptr;
                                                    lVar66 = local_1d80;
                                                    puVar72 = local_1db8;
                                                    pauVar73 = local_1dc0;
                                                    uVar74 = local_1da0;
                                                    pGVar75 = (Geometry *)local_1a60._0_8_;
                                                    uVar78 = local_1ce0._0_8_;
                                                    uVar173 = local_1d00._0_4_;
                                                  }
                                                  auVar55._8_8_ = uStack_1ca8;
                                                  auVar55._0_8_ = local_1cb0;
                                                  auVar102 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                          auVar55);
                                                  auVar91 = auVar102 ^ _DAT_01febe20;
                                                  auVar127._8_4_ = 0xff800000;
                                                  auVar127._0_8_ = 0xff800000ff800000;
                                                  auVar127._12_4_ = 0xff800000;
                                                  auVar102 = vblendvps_avx(auVar127,*(undefined1
                                                                                      (*) [16])
                                                                                     (local_1c00.ray
                                                                                     + 0x80),
                                                                           auVar102);
                                                  *(undefined1 (*) [16])(local_1c00.ray + 0x80) =
                                                       auVar102;
                                                }
                                                auVar108._8_8_ = 0x100000001;
                                                auVar108._0_8_ = 0x100000001;
                                                if ((auVar108 & auVar91) != (undefined1  [16])0x0)
                                                break;
                                                *(undefined4 *)(local_1d28 + lVar66 * 4) = uVar173;
                                                uVar78 = uVar78 ^ 1L << ((ulong)local_1d60 & 0x3f);
                                                uVar65 = 0;
                                                if (uVar78 != 0) {
                                                  for (; (uVar78 >> uVar65 & 1) == 0;
                                                      uVar65 = uVar65 + 1) {
                                                  }
                                                }
                                                local_1c40[0] = uVar78 != 0;
                                              } while (uVar78 != 0);
                                            }
                                            auVar96 = local_1c40._0_32_;
                                            if ((local_1c40._0_32_ & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) goto LAB_00339d29;
                                          }
                                          *(undefined4 *)(local_1c10 + lVar66 * 4) = 0;
                                          auVar96 = local_1c40._0_32_;
                                        }
                                      }
                                    }
                                  }
LAB_00339d29:
                                  local_1c40._0_32_ = auVar96;
                                  uVar74 = uVar74 & uVar74 - 1;
                                  pRVar79 = context;
                                  pRVar80 = ray;
                                  uVar65 = uVar4;
                                } while (uVar74 != 0);
                              }
                              auVar91 = local_1d10 & local_1c10;
                              bVar83 = (((auVar91 >> 0x1f & (undefined1  [16])0x1) ==
                                         (undefined1  [16])0x0 &&
                                        (auVar91 >> 0x3f & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0) &&
                                       (auVar91 >> 0x5f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) && -1 < auVar91[0xf];
                              auVar102 = vandps_avx(local_1c10,local_1d10);
                              auVar91 = local_1d10;
                            }
                            local_1d10 = auVar102;
                          } while ((!bVar83) && (uVar74 = local_1c78 & local_1c78 - 1, uVar74 != 0))
                          ;
                        }
                        lVar68 = local_1c80 + 1;
                      } while (lVar68 != local_1c88);
                      auVar102 = vpcmpeqd_avx(auVar91,auVar91);
                      auVar111 = ZEXT1664(auVar102);
                      auVar102 = auVar102 ^ local_1d10;
                    }
                    local_1d70 = vpor_avx(auVar102,local_1d70);
                    auVar91 = auVar111._0_16_ & ~local_1d70;
                    if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar91[0xf]) goto LAB_0033a149;
                    auVar111 = ZEXT1664(local_1b00);
                    auVar128._8_4_ = 0xff800000;
                    auVar128._0_8_ = 0xff800000ff800000;
                    auVar128._12_4_ = 0xff800000;
                    local_1b00 = vblendvps_avx(local_1b00,auVar128,local_1d70);
                    iVar63 = 0;
                    break;
                  }
                  goto LAB_0033a15a;
                }
                uVar65 = local_1db0.ptr & 0xfffffffffffffff0;
                auVar91 = vcmpps_avx(local_1b00,auVar286._0_16_,6);
                local_1db0.ptr = 8;
                auVar286 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                uVar74 = 0;
                do {
                  uVar4 = *(ulong *)(uVar65 + uVar74 * 8);
                  if (uVar4 != 8) {
                    fVar184 = *(float *)(uVar65 + 0x80 + uVar74 * 4);
                    fVar193 = *(float *)(uVar65 + 0x20 + uVar74 * 4);
                    auVar102 = *(undefined1 (*) [16])(ray + 0x70);
                    fVar131 = auVar102._0_4_;
                    fVar132 = auVar102._4_4_;
                    fVar133 = auVar102._8_4_;
                    fVar134 = auVar102._12_4_;
                    auVar119._0_4_ = fVar131 * fVar184 + fVar193;
                    auVar119._4_4_ = fVar132 * fVar184 + fVar193;
                    auVar119._8_4_ = fVar133 * fVar184 + fVar193;
                    auVar119._12_4_ = fVar134 * fVar184 + fVar193;
                    fVar184 = *(float *)(uVar65 + 0xa0 + uVar74 * 4);
                    fVar193 = *(float *)(uVar65 + 0x40 + uVar74 * 4);
                    auVar136._0_4_ = fVar131 * fVar184 + fVar193;
                    auVar136._4_4_ = fVar132 * fVar184 + fVar193;
                    auVar136._8_4_ = fVar133 * fVar184 + fVar193;
                    auVar136._12_4_ = fVar134 * fVar184 + fVar193;
                    fVar184 = *(float *)(uVar65 + 0xc0 + uVar74 * 4);
                    fVar193 = *(float *)(uVar65 + 0x60 + uVar74 * 4);
                    auVar157._0_4_ = fVar131 * fVar184 + fVar193;
                    auVar157._4_4_ = fVar132 * fVar184 + fVar193;
                    auVar157._8_4_ = fVar133 * fVar184 + fVar193;
                    auVar157._12_4_ = fVar134 * fVar184 + fVar193;
                    fVar184 = *(float *)(uVar65 + 0x90 + uVar74 * 4);
                    fVar193 = *(float *)(uVar65 + 0x30 + uVar74 * 4);
                    auVar175._0_4_ = fVar131 * fVar184 + fVar193;
                    auVar175._4_4_ = fVar132 * fVar184 + fVar193;
                    auVar175._8_4_ = fVar133 * fVar184 + fVar193;
                    auVar175._12_4_ = fVar134 * fVar184 + fVar193;
                    fVar184 = *(float *)(uVar65 + 0xb0 + uVar74 * 4);
                    fVar193 = *(float *)(uVar65 + 0x50 + uVar74 * 4);
                    auVar188._0_4_ = fVar131 * fVar184 + fVar193;
                    auVar188._4_4_ = fVar132 * fVar184 + fVar193;
                    auVar188._8_4_ = fVar133 * fVar184 + fVar193;
                    auVar188._12_4_ = fVar134 * fVar184 + fVar193;
                    fVar184 = *(float *)(uVar65 + 0xd0 + uVar74 * 4);
                    fVar193 = *(float *)(uVar65 + 0x70 + uVar74 * 4);
                    auVar201._0_4_ = fVar193 + fVar131 * fVar184;
                    auVar201._4_4_ = fVar193 + fVar132 * fVar184;
                    auVar201._8_4_ = fVar193 + fVar133 * fVar184;
                    auVar201._12_4_ = fVar193 + fVar134 * fVar184;
                    auVar56._8_8_ = local_1bd0._8_8_;
                    auVar56._0_8_ = local_1bd0._0_8_;
                    auVar58._8_8_ = local_1bd0._24_8_;
                    auVar58._0_8_ = local_1bd0._16_8_;
                    auVar60._8_8_ = local_1bd0._40_8_;
                    auVar60._0_8_ = local_1bd0._32_8_;
                    auVar155 = vsubps_avx(auVar119,auVar56);
                    auVar257._0_4_ = local_1b70._0_4_ * auVar155._0_4_;
                    auVar257._4_4_ = local_1b70._4_4_ * auVar155._4_4_;
                    auVar257._8_4_ = local_1b70._8_4_ * auVar155._8_4_;
                    auVar257._12_4_ = local_1b70._12_4_ * auVar155._12_4_;
                    auVar155 = vsubps_avx(auVar136,auVar58);
                    auVar266._0_4_ = auVar155._0_4_ * (float)local_1b60._0_4_;
                    auVar266._4_4_ = auVar155._4_4_ * (float)local_1b60._4_4_;
                    auVar266._8_4_ = auVar155._8_4_ * fStack_1b58;
                    auVar266._12_4_ = auVar155._12_4_ * fStack_1b54;
                    auVar155 = vsubps_avx(auVar157,auVar60);
                    auVar270._0_4_ = auVar155._0_4_ * (float)local_1b50._0_4_;
                    auVar270._4_4_ = auVar155._4_4_ * (float)local_1b50._4_4_;
                    auVar270._8_4_ = auVar155._8_4_ * fStack_1b48;
                    auVar270._12_4_ = auVar155._12_4_ * fStack_1b44;
                    auVar155 = vsubps_avx(auVar175,auVar56);
                    auVar176._0_4_ = local_1b70._0_4_ * auVar155._0_4_;
                    auVar176._4_4_ = local_1b70._4_4_ * auVar155._4_4_;
                    auVar176._8_4_ = local_1b70._8_4_ * auVar155._8_4_;
                    auVar176._12_4_ = local_1b70._12_4_ * auVar155._12_4_;
                    auVar155 = vsubps_avx(auVar188,auVar58);
                    auVar137._0_4_ = auVar155._0_4_ * (float)local_1b60._0_4_;
                    auVar137._4_4_ = auVar155._4_4_ * (float)local_1b60._4_4_;
                    auVar137._8_4_ = auVar155._8_4_ * fStack_1b58;
                    auVar137._12_4_ = auVar155._12_4_ * fStack_1b54;
                    auVar155 = vsubps_avx(auVar201,auVar60);
                    auVar158._0_4_ = auVar155._0_4_ * (float)local_1b50._0_4_;
                    auVar158._4_4_ = auVar155._4_4_ * (float)local_1b50._4_4_;
                    auVar158._8_4_ = auVar155._8_4_ * fStack_1b48;
                    auVar158._12_4_ = auVar155._12_4_ * fStack_1b44;
                    auVar155 = vpminsd_avx(auVar257,auVar176);
                    auVar101 = vpminsd_avx(auVar266,auVar137);
                    auVar155 = vpmaxsd_avx(auVar155,auVar101);
                    auVar101 = vpminsd_avx(auVar270,auVar158);
                    auVar155 = vpmaxsd_avx(auVar155,auVar101);
                    auVar120._0_4_ = auVar155._0_4_ * 0.99999964;
                    auVar120._4_4_ = auVar155._4_4_ * 0.99999964;
                    auVar120._8_4_ = auVar155._8_4_ * 0.99999964;
                    auVar120._12_4_ = auVar155._12_4_ * 0.99999964;
                    auVar155 = vpmaxsd_avx(auVar257,auVar176);
                    auVar101 = vpmaxsd_avx(auVar266,auVar137);
                    auVar101 = vpminsd_avx(auVar155,auVar101);
                    auVar155 = vpmaxsd_avx(auVar270,auVar158);
                    auVar101 = vpminsd_avx(auVar101,auVar155);
                    auVar155 = vpmaxsd_avx(auVar120,local_1b10);
                    auVar159._0_4_ = auVar101._0_4_ * 1.0000004;
                    auVar159._4_4_ = auVar101._4_4_ * 1.0000004;
                    auVar159._8_4_ = auVar101._8_4_ * 1.0000004;
                    auVar159._12_4_ = auVar101._12_4_ * 1.0000004;
                    auVar101 = vpminsd_avx(auVar159,local_1b00);
                    if ((uVar62 & 7) == 6) {
                      auVar155 = vcmpps_avx(auVar155,auVar101,2);
                      uVar69 = *(undefined4 *)(uVar65 + 0xe0 + uVar74 * 4);
                      auVar160._4_4_ = uVar69;
                      auVar160._0_4_ = uVar69;
                      auVar160._8_4_ = uVar69;
                      auVar160._12_4_ = uVar69;
                      auVar101 = vcmpps_avx(auVar160,auVar102,2);
                      uVar69 = *(undefined4 *)(uVar65 + 0xf0 + uVar74 * 4);
                      auVar177._4_4_ = uVar69;
                      auVar177._0_4_ = uVar69;
                      auVar177._8_4_ = uVar69;
                      auVar177._12_4_ = uVar69;
                      auVar102 = vcmpps_avx(auVar102,auVar177,1);
                      auVar102 = vandps_avx(auVar101,auVar102);
                      auVar102 = vandps_avx(auVar102,auVar155);
                    }
                    else {
                      auVar102 = vcmpps_avx(auVar155,auVar101,2);
                    }
                    auVar102 = vandps_avx(auVar102,auVar91);
                    auVar102 = vpslld_avx(auVar102,0x1f);
                    auVar111 = ZEXT1664(auVar102);
                    if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar102 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar102 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar102[0xf] < '\0') {
                      auVar138._8_4_ = 0x7f800000;
                      auVar138._0_8_ = 0x7f8000007f800000;
                      auVar138._12_4_ = 0x7f800000;
                      auVar102 = vblendvps_avx(auVar138,auVar120,auVar102);
                      auVar111 = ZEXT1664(auVar102);
                      if (local_1db0.ptr != 8) {
                        *puVar72 = local_1db0.ptr;
                        puVar72 = puVar72 + 1;
                        *pauVar73 = auVar286._0_16_;
                        pauVar73 = pauVar73 + 1;
                      }
                      auVar286 = ZEXT1664(auVar102);
                      local_1db0.ptr = uVar4;
                    }
                  }
                } while ((uVar4 != 8) && (bVar83 = uVar74 < 3, uVar74 = uVar74 + 1, bVar83));
                iVar63 = 0;
                if (local_1db0.ptr == 8) {
LAB_00338e71:
                  bVar83 = false;
                  iVar63 = 4;
                }
                else {
                  auVar91 = vcmpps_avx(local_1b00,auVar286._0_16_,6);
                  uVar69 = vmovmskps_avx(auVar91);
                  bVar83 = true;
                  if ((uint)POPCOUNT(uVar69) <= uVar82) {
                    *puVar72 = local_1db0.ptr;
                    puVar72 = puVar72 + 1;
                    *pauVar73 = auVar286._0_16_;
                    pauVar73 = pauVar73 + 1;
                    goto LAB_00338e71;
                  }
                }
              } while (bVar83);
            }
          }
        }
      } while (iVar63 != 3);
      auVar91 = vandps_avx(local_1a20,local_1d70);
      auVar109._8_4_ = 0xff800000;
      auVar109._0_8_ = 0xff800000ff800000;
      auVar109._12_4_ = 0xff800000;
      auVar91 = vmaskmovps_avx(auVar91,auVar109);
      *(undefined1 (*) [16])local_1d28 = auVar91;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }